

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [60];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  byte bVar46;
  uint uVar47;
  ulong uVar48;
  long lVar50;
  uint uVar51;
  ulong uVar52;
  ulong uVar53;
  uint uVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  ulong uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar108 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  float fVar122;
  vint4 bi_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  undefined4 uVar130;
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar146;
  float fVar147;
  vint4 bi;
  undefined1 auVar139 [16];
  float fVar148;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar165;
  float fVar166;
  vint4 ai_2;
  undefined1 auVar160 [16];
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  float fVar224;
  float fVar233;
  float fVar234;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar236;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  float fVar255;
  float fVar256;
  vfloat4 a0;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar257;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  vfloat4 a0_1;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  uint auStack_610 [4];
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined8 uStack_460;
  undefined1 local_440 [64];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar49;
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  
  PVar3 = prim[1];
  uVar53 = (ulong)(byte)PVar3;
  fVar122 = *(float *)(prim + uVar53 * 0x19 + 0x12);
  auVar61 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar61 = vsubps_avx(auVar61,*(undefined1 (*) [16])(prim + uVar53 * 0x19 + 6));
  auVar82._0_4_ = fVar122 * auVar61._0_4_;
  auVar82._4_4_ = fVar122 * auVar61._4_4_;
  auVar82._8_4_ = fVar122 * auVar61._8_4_;
  auVar82._12_4_ = fVar122 * auVar61._12_4_;
  auVar68._0_4_ = fVar122 * auVar62._0_4_;
  auVar68._4_4_ = fVar122 * auVar62._4_4_;
  auVar68._8_4_ = fVar122 * auVar62._8_4_;
  auVar68._12_4_ = fVar122 * auVar62._12_4_;
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 4 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 5 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 6 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0xb + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar53 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  uVar60 = (ulong)(uint)((int)(uVar53 * 9) * 2);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 + uVar53 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  uVar48 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar85._4_4_ = auVar68._0_4_;
  auVar85._0_4_ = auVar68._0_4_;
  auVar85._8_4_ = auVar68._0_4_;
  auVar85._12_4_ = auVar68._0_4_;
  auVar67 = vshufps_avx(auVar68,auVar68,0x55);
  auVar64 = vshufps_avx(auVar68,auVar68,0xaa);
  fVar122 = auVar64._0_4_;
  auVar79._0_4_ = fVar122 * auVar63._0_4_;
  fVar235 = auVar64._4_4_;
  auVar79._4_4_ = fVar235 * auVar63._4_4_;
  fVar224 = auVar64._8_4_;
  auVar79._8_4_ = fVar224 * auVar63._8_4_;
  fVar233 = auVar64._12_4_;
  auVar79._12_4_ = fVar233 * auVar63._12_4_;
  auVar71._0_4_ = auVar73._0_4_ * fVar122;
  auVar71._4_4_ = auVar73._4_4_ * fVar235;
  auVar71._8_4_ = auVar73._8_4_ * fVar224;
  auVar71._12_4_ = auVar73._12_4_ * fVar233;
  auVar69._0_4_ = auVar20._0_4_ * fVar122;
  auVar69._4_4_ = auVar20._4_4_ * fVar235;
  auVar69._8_4_ = auVar20._8_4_ * fVar224;
  auVar69._12_4_ = auVar20._12_4_ * fVar233;
  auVar64 = vfmadd231ps_fma(auVar79,auVar67,auVar62);
  auVar65 = vfmadd231ps_fma(auVar71,auVar67,auVar74);
  auVar67 = vfmadd231ps_fma(auVar69,auVar72,auVar67);
  auVar66 = vfmadd231ps_fma(auVar64,auVar85,auVar61);
  auVar65 = vfmadd231ps_fma(auVar65,auVar85,auVar75);
  auVar68 = vfmadd231ps_fma(auVar67,auVar76,auVar85);
  auVar250._4_4_ = auVar82._0_4_;
  auVar250._0_4_ = auVar82._0_4_;
  auVar250._8_4_ = auVar82._0_4_;
  auVar250._12_4_ = auVar82._0_4_;
  auVar67 = vshufps_avx(auVar82,auVar82,0x55);
  auVar64 = vshufps_avx(auVar82,auVar82,0xaa);
  fVar122 = auVar64._0_4_;
  auVar262._0_4_ = fVar122 * auVar63._0_4_;
  fVar235 = auVar64._4_4_;
  auVar262._4_4_ = fVar235 * auVar63._4_4_;
  fVar224 = auVar64._8_4_;
  auVar262._8_4_ = fVar224 * auVar63._8_4_;
  fVar233 = auVar64._12_4_;
  auVar262._12_4_ = fVar233 * auVar63._12_4_;
  auVar86._0_4_ = auVar73._0_4_ * fVar122;
  auVar86._4_4_ = auVar73._4_4_ * fVar235;
  auVar86._8_4_ = auVar73._8_4_ * fVar224;
  auVar86._12_4_ = auVar73._12_4_ * fVar233;
  auVar81._0_4_ = auVar20._0_4_ * fVar122;
  auVar81._4_4_ = auVar20._4_4_ * fVar235;
  auVar81._8_4_ = auVar20._8_4_ * fVar224;
  auVar81._12_4_ = auVar20._12_4_ * fVar233;
  auVar62 = vfmadd231ps_fma(auVar262,auVar67,auVar62);
  auVar63 = vfmadd231ps_fma(auVar86,auVar67,auVar74);
  auVar74 = vfmadd231ps_fma(auVar81,auVar67,auVar72);
  auVar73 = vfmadd231ps_fma(auVar62,auVar250,auVar61);
  auVar72 = vfmadd231ps_fma(auVar63,auVar250,auVar75);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar271 = ZEXT1664(auVar61);
  auVar20 = vfmadd231ps_fma(auVar74,auVar250,auVar76);
  auVar62 = vandps_avx512vl(auVar66,auVar61);
  auVar78._8_4_ = 0x219392ef;
  auVar78._0_8_ = 0x219392ef219392ef;
  auVar78._12_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar62,auVar78,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar64._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._12_4_;
  auVar62 = vandps_avx512vl(auVar65,auVar61);
  uVar60 = vcmpps_avx512vl(auVar62,auVar78,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar66._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._12_4_;
  auVar61 = vandps_avx512vl(auVar68,auVar61);
  uVar60 = vcmpps_avx512vl(auVar61,auVar78,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar65._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar68._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar68._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar68._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar68._12_4_;
  auVar61 = vrcp14ps_avx512vl(auVar64);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar272 = ZEXT1664(auVar62);
  auVar63 = vfnmadd213ps_avx512vl(auVar64,auVar61,auVar62);
  auVar75 = vfmadd132ps_fma(auVar63,auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar66);
  auVar63 = vfnmadd213ps_avx512vl(auVar66,auVar61,auVar62);
  auVar74 = vfmadd132ps_fma(auVar63,auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar65);
  auVar62 = vfnmadd213ps_avx512vl(auVar65,auVar61,auVar62);
  auVar76 = vfmadd132ps_fma(auVar62,auVar61,auVar61);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar53 * 7 + 6);
  auVar61 = vpmovsxwd_avx(auVar61);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,auVar73);
  auVar77._0_4_ = auVar75._0_4_ * auVar61._0_4_;
  auVar77._4_4_ = auVar75._4_4_ * auVar61._4_4_;
  auVar77._8_4_ = auVar75._8_4_ * auVar61._8_4_;
  auVar77._12_4_ = auVar75._12_4_ * auVar61._12_4_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar53 * 9 + 6);
  auVar61 = vpmovsxwd_avx(auVar62);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,auVar73);
  auVar64 = vpbroadcastd_avx512vl();
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar62 = vpmovsxwd_avx(auVar63);
  auVar80._0_4_ = auVar75._0_4_ * auVar61._0_4_;
  auVar80._4_4_ = auVar75._4_4_ * auVar61._4_4_;
  auVar80._8_4_ = auVar75._8_4_ * auVar61._8_4_;
  auVar80._12_4_ = auVar75._12_4_ * auVar61._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar53 * -2 + 6);
  auVar61 = vpmovsxwd_avx(auVar75);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,auVar72);
  auVar84._0_4_ = auVar74._0_4_ * auVar61._0_4_;
  auVar84._4_4_ = auVar74._4_4_ * auVar61._4_4_;
  auVar84._8_4_ = auVar74._8_4_ * auVar61._8_4_;
  auVar84._12_4_ = auVar74._12_4_ * auVar61._12_4_;
  auVar61 = vcvtdq2ps_avx(auVar62);
  auVar61 = vsubps_avx(auVar61,auVar72);
  auVar83._0_4_ = auVar74._0_4_ * auVar61._0_4_;
  auVar83._4_4_ = auVar74._4_4_ * auVar61._4_4_;
  auVar83._8_4_ = auVar74._8_4_ * auVar61._8_4_;
  auVar83._12_4_ = auVar74._12_4_ * auVar61._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar48 + uVar53 + 6);
  auVar61 = vpmovsxwd_avx(auVar74);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,auVar20);
  auVar160._0_4_ = auVar76._0_4_ * auVar61._0_4_;
  auVar160._4_4_ = auVar76._4_4_ * auVar61._4_4_;
  auVar160._8_4_ = auVar76._8_4_ * auVar61._8_4_;
  auVar160._12_4_ = auVar76._12_4_ * auVar61._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar53 * 0x17 + 6);
  auVar61 = vpmovsxwd_avx(auVar73);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,auVar20);
  auVar70._0_4_ = auVar76._0_4_ * auVar61._0_4_;
  auVar70._4_4_ = auVar76._4_4_ * auVar61._4_4_;
  auVar70._8_4_ = auVar76._8_4_ * auVar61._8_4_;
  auVar70._12_4_ = auVar76._12_4_ * auVar61._12_4_;
  auVar61 = vpminsd_avx(auVar77,auVar80);
  auVar62 = vpminsd_avx(auVar84,auVar83);
  auVar61 = vmaxps_avx(auVar61,auVar62);
  auVar62 = vpminsd_avx(auVar160,auVar70);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar76._4_4_ = uVar130;
  auVar76._0_4_ = uVar130;
  auVar76._8_4_ = uVar130;
  auVar76._12_4_ = uVar130;
  auVar62 = vmaxps_avx512vl(auVar62,auVar76);
  auVar61 = vmaxps_avx(auVar61,auVar62);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  local_600 = vmulps_avx512vl(auVar61,auVar72);
  auVar61 = vpmaxsd_avx(auVar77,auVar80);
  auVar62 = vpmaxsd_avx(auVar84,auVar83);
  auVar61 = vminps_avx(auVar61,auVar62);
  auVar62 = vpmaxsd_avx(auVar160,auVar70);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar20._4_4_ = uVar130;
  auVar20._0_4_ = uVar130;
  auVar20._8_4_ = uVar130;
  auVar20._12_4_ = uVar130;
  auVar62 = vminps_avx512vl(auVar62,auVar20);
  auVar61 = vminps_avx(auVar61,auVar62);
  auVar67._8_4_ = 0x3f800003;
  auVar67._0_8_ = 0x3f8000033f800003;
  auVar67._12_4_ = 0x3f800003;
  auVar61 = vmulps_avx512vl(auVar61,auVar67);
  uVar21 = vcmpps_avx512vl(local_600,auVar61,2);
  uVar60 = vpcmpgtd_avx512vl(auVar64,_DAT_01f7fcf0);
  uVar60 = ((byte)uVar21 & 0xf) & uVar60;
  if ((char)uVar60 != '\0') {
    auVar129 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_380 = vmovdqa64_avx512f(auVar129);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar274 = ZEXT1664(auVar61);
    auVar129 = ZEXT464(0x3f800000);
    do {
      lVar50 = 0;
      for (uVar48 = uVar60; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
        lVar50 = lVar50 + 1;
      }
      uVar54 = *(uint *)(prim + 2);
      uVar4 = *(uint *)(prim + lVar50 * 4 + 6);
      pGVar6 = (context->scene->geometries).items[uVar54].ptr;
      uVar48 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar4);
      p_Var7 = pGVar6[1].intersectionFilterN;
      pvVar8 = pGVar6[2].userPtr;
      _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar61 = *(undefined1 (*) [16])(_Var9 + uVar48 * (long)pvVar8);
      auVar62 = *(undefined1 (*) [16])(_Var9 + (uVar48 + 1) * (long)pvVar8);
      auVar63 = *(undefined1 (*) [16])(_Var9 + (uVar48 + 2) * (long)pvVar8);
      auVar75 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar48 + 3));
      lVar50 = *(long *)&pGVar6[1].time_range.upper;
      auVar74 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * uVar48);
      auVar73 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar48 + 1));
      auVar76 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar48 + 2));
      uVar60 = uVar60 - 1 & uVar60;
      auVar72 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar48 + 3));
      if (uVar60 != 0) {
        uVar53 = uVar60 - 1 & uVar60;
        for (uVar48 = uVar60; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
        }
        if (uVar53 != 0) {
          for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      fVar122 = *(float *)(ray + k * 4 + 0xc0);
      auVar79 = auVar274._0_16_;
      auVar64 = vmulps_avx512vl(auVar72,auVar79);
      auVar131._0_12_ = ZEXT812(0);
      auVar131._12_4_ = 0;
      auVar67 = vfmadd213ps_fma(auVar131,auVar76,auVar64);
      auVar132._0_4_ = auVar73._0_4_ + auVar67._0_4_;
      auVar132._4_4_ = auVar73._4_4_ + auVar67._4_4_;
      auVar132._8_4_ = auVar73._8_4_ + auVar67._8_4_;
      auVar132._12_4_ = auVar73._12_4_ + auVar67._12_4_;
      auVar65 = vfmadd231ps_avx512vl(auVar132,auVar74,auVar79);
      auVar83 = ZEXT816(0) << 0x40;
      auVar139._0_4_ = auVar72._0_4_ * 0.0;
      auVar139._4_4_ = auVar72._4_4_ * 0.0;
      auVar139._8_4_ = auVar72._8_4_ * 0.0;
      auVar139._12_4_ = auVar72._12_4_ * 0.0;
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar67 = vfmadd231ps_avx512vl(auVar139,auVar76,auVar66);
      auVar67 = vfmadd231ps_fma(auVar67,auVar73,auVar83);
      auVar68 = vfnmadd231ps_avx512vl(auVar67,auVar74,auVar66);
      auVar69 = vmulps_avx512vl(auVar75,auVar79);
      auVar67 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar63,auVar69);
      auVar251._0_4_ = auVar67._0_4_ + auVar62._0_4_;
      auVar251._4_4_ = auVar67._4_4_ + auVar62._4_4_;
      auVar251._8_4_ = auVar67._8_4_ + auVar62._8_4_;
      auVar251._12_4_ = auVar67._12_4_ + auVar62._12_4_;
      auVar70 = vfmadd231ps_avx512vl(auVar251,auVar61,auVar79);
      auVar258._0_4_ = auVar75._0_4_ * 0.0;
      auVar258._4_4_ = auVar75._4_4_ * 0.0;
      auVar258._8_4_ = auVar75._8_4_ * 0.0;
      auVar258._12_4_ = auVar75._12_4_ * 0.0;
      auVar67 = vfmadd231ps_avx512vl(auVar258,auVar63,auVar66);
      auVar67 = vfmadd231ps_fma(auVar67,auVar62,auVar83);
      auVar71 = vfnmadd231ps_avx512vl(auVar67,auVar61,auVar66);
      auVar149._0_4_ = auVar76._0_4_ + auVar64._0_4_;
      auVar149._4_4_ = auVar76._4_4_ + auVar64._4_4_;
      auVar149._8_4_ = auVar76._8_4_ + auVar64._8_4_;
      auVar149._12_4_ = auVar76._12_4_ + auVar64._12_4_;
      auVar67 = vfmadd231ps_fma(auVar149,auVar73,auVar83);
      auVar67 = vfmadd231ps_avx512vl(auVar67,auVar74,auVar79);
      auVar72 = vmulps_avx512vl(auVar72,auVar66);
      auVar76 = vfmadd231ps_fma(auVar72,auVar83,auVar76);
      auVar73 = vfnmadd231ps_avx512vl(auVar76,auVar66,auVar73);
      auVar76 = vfmadd231ps_fma(auVar73,auVar83,auVar74);
      auVar208._0_4_ = auVar69._0_4_ + auVar63._0_4_;
      auVar208._4_4_ = auVar69._4_4_ + auVar63._4_4_;
      auVar208._8_4_ = auVar69._8_4_ + auVar63._8_4_;
      auVar208._12_4_ = auVar69._12_4_ + auVar63._12_4_;
      auVar74 = vfmadd231ps_fma(auVar208,auVar62,auVar83);
      auVar74 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar79);
      auVar75 = vmulps_avx512vl(auVar75,auVar66);
      auVar63 = vfmadd231ps_fma(auVar75,auVar83,auVar63);
      auVar62 = vfnmadd231ps_avx512vl(auVar63,auVar66,auVar62);
      auVar73 = vfmadd231ps_fma(auVar62,auVar83,auVar61);
      auVar61 = vshufps_avx(auVar68,auVar68,0xc9);
      auVar62 = vshufps_avx(auVar70,auVar70,0xc9);
      fVar138 = auVar68._0_4_;
      auVar177._0_4_ = fVar138 * auVar62._0_4_;
      fVar146 = auVar68._4_4_;
      auVar177._4_4_ = fVar146 * auVar62._4_4_;
      fVar147 = auVar68._8_4_;
      auVar177._8_4_ = fVar147 * auVar62._8_4_;
      fVar148 = auVar68._12_4_;
      auVar177._12_4_ = fVar148 * auVar62._12_4_;
      auVar62 = vfmsub231ps_fma(auVar177,auVar61,auVar70);
      auVar63 = vshufps_avx(auVar62,auVar62,0xc9);
      auVar62 = vshufps_avx(auVar71,auVar71,0xc9);
      auVar178._0_4_ = fVar138 * auVar62._0_4_;
      auVar178._4_4_ = fVar146 * auVar62._4_4_;
      auVar178._8_4_ = fVar147 * auVar62._8_4_;
      auVar178._12_4_ = fVar148 * auVar62._12_4_;
      auVar61 = vfmsub231ps_fma(auVar178,auVar61,auVar71);
      auVar75 = vshufps_avx(auVar61,auVar61,0xc9);
      auVar61 = vshufps_avx(auVar76,auVar76,0xc9);
      auVar62 = vshufps_avx(auVar74,auVar74,0xc9);
      fVar159 = auVar76._0_4_;
      auVar168._0_4_ = fVar159 * auVar62._0_4_;
      fVar165 = auVar76._4_4_;
      auVar168._4_4_ = fVar165 * auVar62._4_4_;
      fVar166 = auVar76._8_4_;
      auVar168._8_4_ = fVar166 * auVar62._8_4_;
      fVar167 = auVar76._12_4_;
      auVar168._12_4_ = fVar167 * auVar62._12_4_;
      auVar62 = vfmsub231ps_fma(auVar168,auVar61,auVar74);
      auVar74 = vshufps_avx(auVar62,auVar62,0xc9);
      auVar62 = vshufps_avx(auVar73,auVar73,0xc9);
      auVar209._0_4_ = auVar62._0_4_ * fVar159;
      auVar209._4_4_ = auVar62._4_4_ * fVar165;
      auVar209._8_4_ = auVar62._8_4_ * fVar166;
      auVar209._12_4_ = auVar62._12_4_ * fVar167;
      auVar62 = vfmsub231ps_fma(auVar209,auVar61,auVar73);
      auVar61 = vdpps_avx(auVar63,auVar63,0x7f);
      auVar73 = vshufps_avx(auVar62,auVar62,0xc9);
      fVar224 = auVar61._0_4_;
      auVar210._4_12_ = ZEXT812(0) << 0x20;
      auVar210._0_4_ = fVar224;
      auVar62 = vrsqrt14ss_avx512f(auVar83,auVar210);
      auVar72 = vmulss_avx512f(auVar62,ZEXT416(0x3fc00000));
      auVar64 = vmulss_avx512f(auVar61,ZEXT416(0xbf000000));
      fVar235 = auVar62._0_4_;
      auVar62 = vdpps_avx(auVar63,auVar75,0x7f);
      fVar235 = auVar72._0_4_ + auVar64._0_4_ * fVar235 * fVar235 * fVar235;
      fVar236 = fVar235 * auVar63._0_4_;
      fVar246 = fVar235 * auVar63._4_4_;
      fVar247 = fVar235 * auVar63._8_4_;
      fVar248 = fVar235 * auVar63._12_4_;
      auVar219._0_4_ = auVar75._0_4_ * fVar224;
      auVar219._4_4_ = auVar75._4_4_ * fVar224;
      auVar219._8_4_ = auVar75._8_4_ * fVar224;
      auVar219._12_4_ = auVar75._12_4_ * fVar224;
      fVar224 = auVar62._0_4_;
      auVar190._0_4_ = fVar224 * auVar63._0_4_;
      auVar190._4_4_ = fVar224 * auVar63._4_4_;
      auVar190._8_4_ = fVar224 * auVar63._8_4_;
      auVar190._12_4_ = fVar224 * auVar63._12_4_;
      auVar63 = vsubps_avx(auVar219,auVar190);
      auVar62 = vrcp14ss_avx512f(auVar83,auVar210);
      auVar61 = vfnmadd213ss_avx512f(auVar61,auVar62,ZEXT416(0x40000000));
      fVar233 = auVar62._0_4_ * auVar61._0_4_;
      auVar61 = vdpps_avx(auVar74,auVar74,0x7f);
      fVar234 = auVar61._0_4_;
      auVar211._4_12_ = ZEXT812(0) << 0x20;
      auVar211._0_4_ = fVar234;
      auVar62 = vrsqrt14ss_avx512f(auVar83,auVar211);
      auVar75 = vmulss_avx512f(auVar62,ZEXT416(0x3fc00000));
      auVar72 = vmulss_avx512f(auVar61,ZEXT416(0xbf000000));
      fVar224 = auVar62._0_4_;
      fVar224 = auVar75._0_4_ + auVar72._0_4_ * fVar224 * fVar224 * fVar224;
      auVar62 = vdpps_avx(auVar74,auVar73,0x7f);
      fVar249 = fVar224 * auVar74._0_4_;
      fVar255 = fVar224 * auVar74._4_4_;
      fVar256 = fVar224 * auVar74._8_4_;
      fVar257 = fVar224 * auVar74._12_4_;
      auVar179._0_4_ = fVar234 * auVar73._0_4_;
      auVar179._4_4_ = fVar234 * auVar73._4_4_;
      auVar179._8_4_ = fVar234 * auVar73._8_4_;
      auVar179._12_4_ = fVar234 * auVar73._12_4_;
      fVar234 = auVar62._0_4_;
      auVar169._0_4_ = fVar234 * auVar74._0_4_;
      auVar169._4_4_ = fVar234 * auVar74._4_4_;
      auVar169._8_4_ = fVar234 * auVar74._8_4_;
      auVar169._12_4_ = fVar234 * auVar74._12_4_;
      auVar75 = vsubps_avx(auVar179,auVar169);
      auVar62 = vrcp14ss_avx512f(auVar83,auVar211);
      auVar61 = vfnmadd213ss_avx512f(auVar61,auVar62,ZEXT416(0x40000000));
      fVar234 = auVar61._0_4_ * auVar62._0_4_;
      auVar61 = vshufps_avx(auVar65,auVar65,0xff);
      auVar196._0_4_ = fVar236 * auVar61._0_4_;
      auVar196._4_4_ = fVar246 * auVar61._4_4_;
      auVar196._8_4_ = fVar247 * auVar61._8_4_;
      auVar196._12_4_ = fVar248 * auVar61._12_4_;
      local_540 = vsubps_avx(auVar65,auVar196);
      auVar62 = vshufps_avx(auVar68,auVar68,0xff);
      auVar180._0_4_ = auVar62._0_4_ * fVar236 + auVar61._0_4_ * fVar235 * fVar233 * auVar63._0_4_;
      auVar180._4_4_ = auVar62._4_4_ * fVar246 + auVar61._4_4_ * fVar235 * fVar233 * auVar63._4_4_;
      auVar180._8_4_ = auVar62._8_4_ * fVar247 + auVar61._8_4_ * fVar235 * fVar233 * auVar63._8_4_;
      auVar180._12_4_ =
           auVar62._12_4_ * fVar248 + auVar61._12_4_ * fVar235 * fVar233 * auVar63._12_4_;
      auVar63 = vsubps_avx(auVar68,auVar180);
      local_550._0_4_ = auVar196._0_4_ + auVar65._0_4_;
      local_550._4_4_ = auVar196._4_4_ + auVar65._4_4_;
      fStack_548 = auVar196._8_4_ + auVar65._8_4_;
      fStack_544 = auVar196._12_4_ + auVar65._12_4_;
      auVar61 = vshufps_avx(auVar67,auVar67,0xff);
      auVar181._0_4_ = fVar249 * auVar61._0_4_;
      auVar181._4_4_ = fVar255 * auVar61._4_4_;
      auVar181._8_4_ = fVar256 * auVar61._8_4_;
      auVar181._12_4_ = fVar257 * auVar61._12_4_;
      local_560 = vsubps_avx512vl(auVar67,auVar181);
      auVar62 = vshufps_avx(auVar76,auVar76,0xff);
      auVar140._0_4_ = auVar62._0_4_ * fVar249 + auVar61._0_4_ * fVar224 * auVar75._0_4_ * fVar234;
      auVar140._4_4_ = auVar62._4_4_ * fVar255 + auVar61._4_4_ * fVar224 * auVar75._4_4_ * fVar234;
      auVar140._8_4_ = auVar62._8_4_ * fVar256 + auVar61._8_4_ * fVar224 * auVar75._8_4_ * fVar234;
      auVar140._12_4_ =
           auVar62._12_4_ * fVar257 + auVar61._12_4_ * fVar224 * auVar75._12_4_ * fVar234;
      auVar61 = vsubps_avx(auVar76,auVar140);
      local_570._0_4_ = auVar67._0_4_ + auVar181._0_4_;
      local_570._4_4_ = auVar67._4_4_ + auVar181._4_4_;
      fStack_568 = auVar67._8_4_ + auVar181._8_4_;
      fStack_564 = auVar67._12_4_ + auVar181._12_4_;
      auVar150._0_4_ = auVar63._0_4_ * 0.33333334;
      auVar150._4_4_ = auVar63._4_4_ * 0.33333334;
      auVar150._8_4_ = auVar63._8_4_ * 0.33333334;
      auVar150._12_4_ = auVar63._12_4_ * 0.33333334;
      local_580 = vaddps_avx512vl(local_540,auVar150);
      auVar151._0_4_ = auVar61._0_4_ * 0.33333334;
      auVar151._4_4_ = auVar61._4_4_ * 0.33333334;
      auVar151._8_4_ = auVar61._8_4_ * 0.33333334;
      auVar151._12_4_ = auVar61._12_4_ * 0.33333334;
      local_590 = vsubps_avx512vl(local_560,auVar151);
      auVar133._0_4_ = (fVar138 + auVar180._0_4_) * 0.33333334;
      auVar133._4_4_ = (fVar146 + auVar180._4_4_) * 0.33333334;
      auVar133._8_4_ = (fVar147 + auVar180._8_4_) * 0.33333334;
      auVar133._12_4_ = (fVar148 + auVar180._12_4_) * 0.33333334;
      _local_5a0 = vaddps_avx512vl(_local_550,auVar133);
      auVar134._0_4_ = (fVar159 + auVar140._0_4_) * 0.33333334;
      auVar134._4_4_ = (fVar165 + auVar140._4_4_) * 0.33333334;
      auVar134._8_4_ = (fVar166 + auVar140._8_4_) * 0.33333334;
      auVar134._12_4_ = (fVar167 + auVar140._12_4_) * 0.33333334;
      _local_5b0 = vsubps_avx512vl(_local_570,auVar134);
      local_4c0 = vsubps_avx(local_540,auVar20);
      uVar130 = local_4c0._0_4_;
      auVar141._4_4_ = uVar130;
      auVar141._0_4_ = uVar130;
      auVar141._8_4_ = uVar130;
      auVar141._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_4c0,local_4c0,0x55);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      auVar62 = vshufps_avx(local_4c0,local_4c0,0xaa);
      fVar235 = pre->ray_space[k].vz.field_0.m128[0];
      fVar224 = pre->ray_space[k].vz.field_0.m128[1];
      fVar233 = pre->ray_space[k].vz.field_0.m128[2];
      fVar234 = pre->ray_space[k].vz.field_0.m128[3];
      auVar135._0_4_ = fVar235 * auVar62._0_4_;
      auVar135._4_4_ = fVar224 * auVar62._4_4_;
      auVar135._8_4_ = fVar233 * auVar62._8_4_;
      auVar135._12_4_ = fVar234 * auVar62._12_4_;
      auVar61 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar2,auVar61);
      auVar74 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar141);
      local_4d0 = vsubps_avx512vl(local_580,auVar20);
      uVar130 = local_4d0._0_4_;
      auVar152._4_4_ = uVar130;
      auVar152._0_4_ = uVar130;
      auVar152._8_4_ = uVar130;
      auVar152._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_4d0,local_4d0,0x55);
      auVar62 = vshufps_avx(local_4d0,local_4d0,0xaa);
      auVar142._0_4_ = fVar235 * auVar62._0_4_;
      auVar142._4_4_ = fVar224 * auVar62._4_4_;
      auVar142._8_4_ = fVar233 * auVar62._8_4_;
      auVar142._12_4_ = fVar234 * auVar62._12_4_;
      auVar61 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar2,auVar61);
      auVar73 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar152);
      local_4e0 = vsubps_avx512vl(local_590,auVar20);
      uVar130 = local_4e0._0_4_;
      auVar182._4_4_ = uVar130;
      auVar182._0_4_ = uVar130;
      auVar182._8_4_ = uVar130;
      auVar182._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_4e0,local_4e0,0x55);
      auVar62 = vshufps_avx(local_4e0,local_4e0,0xaa);
      auVar153._0_4_ = fVar235 * auVar62._0_4_;
      auVar153._4_4_ = fVar224 * auVar62._4_4_;
      auVar153._8_4_ = fVar233 * auVar62._8_4_;
      auVar153._12_4_ = fVar234 * auVar62._12_4_;
      auVar61 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar2,auVar61);
      auVar76 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar182);
      local_4f0 = vsubps_avx512vl(local_560,auVar20);
      uVar130 = local_4f0._0_4_;
      auVar197._4_4_ = uVar130;
      auVar197._0_4_ = uVar130;
      auVar197._8_4_ = uVar130;
      auVar197._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_4f0,local_4f0,0x55);
      auVar62 = vshufps_avx(local_4f0,local_4f0,0xaa);
      auVar183._0_4_ = fVar235 * auVar62._0_4_;
      auVar183._4_4_ = fVar224 * auVar62._4_4_;
      auVar183._8_4_ = fVar233 * auVar62._8_4_;
      auVar183._12_4_ = fVar234 * auVar62._12_4_;
      auVar61 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar2,auVar61);
      auVar72 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar197);
      local_500 = vsubps_avx(_local_550,auVar20);
      uVar130 = local_500._0_4_;
      auVar198._4_4_ = uVar130;
      auVar198._0_4_ = uVar130;
      auVar198._8_4_ = uVar130;
      auVar198._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_500,local_500,0x55);
      auVar62 = vshufps_avx(local_500,local_500,0xaa);
      auVar220._0_4_ = auVar62._0_4_ * fVar235;
      auVar220._4_4_ = auVar62._4_4_ * fVar224;
      auVar220._8_4_ = auVar62._8_4_ * fVar233;
      auVar220._12_4_ = auVar62._12_4_ * fVar234;
      auVar61 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar61);
      auVar67 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar198);
      local_510 = vsubps_avx512vl(_local_5a0,auVar20);
      uVar130 = local_510._0_4_;
      auVar199._4_4_ = uVar130;
      auVar199._0_4_ = uVar130;
      auVar199._8_4_ = uVar130;
      auVar199._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_510,local_510,0x55);
      auVar62 = vshufps_avx(local_510,local_510,0xaa);
      auVar225._0_4_ = auVar62._0_4_ * fVar235;
      auVar225._4_4_ = auVar62._4_4_ * fVar224;
      auVar225._8_4_ = auVar62._8_4_ * fVar233;
      auVar225._12_4_ = auVar62._12_4_ * fVar234;
      auVar61 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar2,auVar61);
      auVar64 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar199);
      local_520 = vsubps_avx512vl(_local_5b0,auVar20);
      uVar130 = local_520._0_4_;
      auVar200._4_4_ = uVar130;
      auVar200._0_4_ = uVar130;
      auVar200._8_4_ = uVar130;
      auVar200._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_520,local_520,0x55);
      auVar62 = vshufps_avx(local_520,local_520,0xaa);
      auVar237._0_4_ = auVar62._0_4_ * fVar235;
      auVar237._4_4_ = auVar62._4_4_ * fVar224;
      auVar237._8_4_ = auVar62._8_4_ * fVar233;
      auVar237._12_4_ = auVar62._12_4_ * fVar234;
      auVar61 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar2,auVar61);
      auVar65 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar200);
      local_530 = vsubps_avx(_local_570,auVar20);
      uVar130 = local_530._0_4_;
      auVar123._4_4_ = uVar130;
      auVar123._0_4_ = uVar130;
      auVar123._8_4_ = uVar130;
      auVar123._12_4_ = uVar130;
      auVar61 = vshufps_avx(local_530,local_530,0x55);
      auVar62 = vshufps_avx(local_530,local_530,0xaa);
      auVar191._0_4_ = auVar62._0_4_ * fVar235;
      auVar191._4_4_ = auVar62._4_4_ * fVar224;
      auVar191._8_4_ = auVar62._8_4_ * fVar233;
      auVar191._12_4_ = auVar62._12_4_ * fVar234;
      auVar61 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar2,auVar61);
      auVar20 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar123);
      auVar63 = vmovlhps_avx(auVar74,auVar67);
      local_620 = vmovlhps_avx(auVar73,auVar64);
      local_630 = vmovlhps_avx512f(auVar76,auVar65);
      _local_480 = vmovlhps_avx512f(auVar72,auVar20);
      auVar62 = vminps_avx(auVar63,local_620);
      auVar61 = vmaxps_avx(auVar63,local_620);
      auVar75 = vminps_avx512vl(local_630,_local_480);
      auVar62 = vminps_avx(auVar62,auVar75);
      auVar75 = vmaxps_avx512vl(local_630,_local_480);
      auVar61 = vmaxps_avx(auVar61,auVar75);
      auVar75 = vshufpd_avx(auVar62,auVar62,3);
      auVar62 = vminps_avx(auVar62,auVar75);
      auVar75 = vshufpd_avx(auVar61,auVar61,3);
      auVar61 = vmaxps_avx(auVar61,auVar75);
      auVar62 = vandps_avx512vl(auVar62,auVar271._0_16_);
      auVar61 = vandps_avx512vl(auVar61,auVar271._0_16_);
      auVar61 = vmaxps_avx(auVar62,auVar61);
      auVar62 = vmovshdup_avx(auVar61);
      auVar61 = vmaxss_avx(auVar62,auVar61);
      fVar235 = auVar61._0_4_ * 9.536743e-07;
      local_640 = vmovddup_avx512vl(auVar74);
      auVar273 = ZEXT1664(local_640);
      auVar62 = vmovddup_avx512vl(auVar73);
      auVar75 = vmovddup_avx512vl(auVar76);
      auVar74 = vmovddup_avx512vl(auVar72);
      local_470 = ZEXT416((uint)fVar235);
      auVar124._4_4_ = fVar235;
      auVar124._0_4_ = fVar235;
      auVar124._8_4_ = fVar235;
      auVar124._12_4_ = fVar235;
      local_3c0._16_4_ = fVar235;
      local_3c0._0_16_ = auVar124;
      local_3c0._20_4_ = fVar235;
      local_3c0._24_4_ = fVar235;
      local_3c0._28_4_ = fVar235;
      auVar61 = vxorps_avx512vl(auVar124,auVar79);
      local_3e0 = auVar61._0_4_;
      uStack_3dc = local_3e0;
      uStack_3d8 = local_3e0;
      uStack_3d4 = local_3e0;
      uStack_3d0 = local_3e0;
      uStack_3cc = local_3e0;
      uStack_3c8 = local_3e0;
      uStack_3c4 = local_3e0;
      uVar48 = 0;
      local_490 = vsubps_avx(local_620,auVar63);
      local_4a0 = vsubps_avx512vl(local_630,local_620);
      local_4b0 = vsubps_avx512vl(_local_480,local_630);
      local_5c0 = vsubps_avx(_local_550,local_540);
      local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
      local_5e0 = vsubps_avx512vl(_local_5b0,local_590);
      _local_5f0 = vsubps_avx512vl(_local_570,local_560);
      auVar108 = vpbroadcastd_avx512f();
      local_300 = vmovdqa64_avx512f(auVar108);
      auVar108 = vpbroadcastd_avx512f();
      local_340 = vmovdqa64_avx512f(auVar108);
      auVar61 = ZEXT816(0x3f80000000000000);
      auVar136 = auVar61;
LAB_01ae898a:
      auVar73 = vshufps_avx(auVar136,auVar136,0x50);
      auVar259._8_4_ = 0x3f800000;
      auVar259._0_8_ = 0x3f8000003f800000;
      auVar259._12_4_ = 0x3f800000;
      auVar107._16_4_ = 0x3f800000;
      auVar107._0_16_ = auVar259;
      auVar107._20_4_ = 0x3f800000;
      auVar107._24_4_ = 0x3f800000;
      auVar107._28_4_ = 0x3f800000;
      auVar76 = vsubps_avx(auVar259,auVar73);
      fVar235 = auVar73._0_4_;
      fVar138 = auVar67._0_4_;
      auVar161._0_4_ = fVar138 * fVar235;
      fVar224 = auVar73._4_4_;
      fVar146 = auVar67._4_4_;
      auVar161._4_4_ = fVar146 * fVar224;
      fVar233 = auVar73._8_4_;
      auVar161._8_4_ = fVar138 * fVar233;
      fVar234 = auVar73._12_4_;
      auVar161._12_4_ = fVar146 * fVar234;
      fVar147 = auVar64._0_4_;
      auVar170._0_4_ = fVar147 * fVar235;
      fVar148 = auVar64._4_4_;
      auVar170._4_4_ = fVar148 * fVar224;
      auVar170._8_4_ = fVar147 * fVar233;
      auVar170._12_4_ = fVar148 * fVar234;
      fVar159 = auVar65._0_4_;
      auVar184._0_4_ = fVar159 * fVar235;
      fVar165 = auVar65._4_4_;
      auVar184._4_4_ = fVar165 * fVar224;
      auVar184._8_4_ = fVar159 * fVar233;
      auVar184._12_4_ = fVar165 * fVar234;
      fVar166 = auVar20._0_4_;
      auVar143._0_4_ = fVar166 * fVar235;
      fVar167 = auVar20._4_4_;
      auVar143._4_4_ = fVar167 * fVar224;
      auVar143._8_4_ = fVar166 * fVar233;
      auVar143._12_4_ = fVar167 * fVar234;
      auVar72 = vfmadd231ps_avx512vl(auVar161,auVar76,auVar273._0_16_);
      auVar66 = vfmadd231ps_avx512vl(auVar170,auVar76,auVar62);
      auVar68 = vfmadd231ps_avx512vl(auVar184,auVar76,auVar75);
      auVar76 = vfmadd231ps_avx512vl(auVar143,auVar74,auVar76);
      auVar73 = vmovshdup_avx(auVar61);
      fVar224 = auVar61._0_4_;
      fVar235 = (auVar73._0_4_ - fVar224) * 0.04761905;
      auVar101._4_4_ = fVar224;
      auVar101._0_4_ = fVar224;
      auVar101._8_4_ = fVar224;
      auVar101._12_4_ = fVar224;
      auVar101._16_4_ = fVar224;
      auVar101._20_4_ = fVar224;
      auVar101._24_4_ = fVar224;
      auVar101._28_4_ = fVar224;
      auVar91._0_8_ = auVar73._0_8_;
      auVar91._8_8_ = auVar91._0_8_;
      auVar91._16_8_ = auVar91._0_8_;
      auVar91._24_8_ = auVar91._0_8_;
      auVar104 = vsubps_avx(auVar91,auVar101);
      uVar130 = auVar72._0_4_;
      auVar105._4_4_ = uVar130;
      auVar105._0_4_ = uVar130;
      auVar105._8_4_ = uVar130;
      auVar105._12_4_ = uVar130;
      auVar105._16_4_ = uVar130;
      auVar105._20_4_ = uVar130;
      auVar105._24_4_ = uVar130;
      auVar105._28_4_ = uVar130;
      auVar93._8_4_ = 1;
      auVar93._0_8_ = 0x100000001;
      auVar93._12_4_ = 1;
      auVar93._16_4_ = 1;
      auVar93._20_4_ = 1;
      auVar93._24_4_ = 1;
      auVar93._28_4_ = 1;
      auVar103 = ZEXT1632(auVar72);
      auVar102 = vpermps_avx2(auVar93,auVar103);
      auVar120._32_32_ = auVar108._32_32_;
      auVar87 = vbroadcastss_avx512vl(auVar66);
      auVar97 = ZEXT1632(auVar66);
      auVar88 = vpermps_avx512vl(auVar93,auVar97);
      auVar89 = vbroadcastss_avx512vl(auVar68);
      auVar98 = ZEXT1632(auVar68);
      auVar90 = vpermps_avx512vl(auVar93,auVar98);
      auVar91 = vbroadcastss_avx512vl(auVar76);
      auVar100 = ZEXT1632(auVar76);
      auVar92 = vpermps_avx512vl(auVar93,auVar100);
      auVar106._4_4_ = fVar235;
      auVar106._0_4_ = fVar235;
      auVar106._8_4_ = fVar235;
      auVar106._12_4_ = fVar235;
      auVar106._16_4_ = fVar235;
      auVar106._20_4_ = fVar235;
      auVar106._24_4_ = fVar235;
      auVar106._28_4_ = fVar235;
      auVar99._8_4_ = 2;
      auVar99._0_8_ = 0x200000002;
      auVar99._12_4_ = 2;
      auVar99._16_4_ = 2;
      auVar99._20_4_ = 2;
      auVar99._24_4_ = 2;
      auVar99._28_4_ = 2;
      auVar93 = vpermps_avx512vl(auVar99,auVar103);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar95 = vpermps_avx512vl(auVar94,auVar103);
      auVar96 = vpermps_avx512vl(auVar99,auVar97);
      auVar97 = vpermps_avx512vl(auVar94,auVar97);
      auVar103 = vpermps_avx2(auVar99,auVar98);
      auVar98 = vpermps_avx512vl(auVar94,auVar98);
      auVar99 = vpermps_avx512vl(auVar99,auVar100);
      auVar94 = vpermps_avx512vl(auVar94,auVar100);
      auVar73 = vfmadd132ps_fma(auVar104,auVar101,_DAT_01faff20);
      auVar104 = vsubps_avx(auVar107,ZEXT1632(auVar73));
      auVar100 = vmulps_avx512vl(auVar87,ZEXT1632(auVar73));
      auVar107 = ZEXT1632(auVar73);
      auVar101 = vmulps_avx512vl(auVar88,auVar107);
      auVar76 = vfmadd231ps_fma(auVar100,auVar104,auVar105);
      auVar72 = vfmadd231ps_fma(auVar101,auVar104,auVar102);
      auVar100 = vmulps_avx512vl(auVar89,auVar107);
      auVar101 = vmulps_avx512vl(auVar90,auVar107);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar87);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar88);
      auVar87 = vmulps_avx512vl(auVar91,auVar107);
      auVar105 = ZEXT1632(auVar73);
      auVar88 = vmulps_avx512vl(auVar92,auVar105);
      auVar89 = vfmadd231ps_avx512vl(auVar87,auVar104,auVar89);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar104,auVar90);
      fVar233 = auVar73._0_4_;
      fVar234 = auVar73._4_4_;
      auVar87._4_4_ = fVar234 * auVar100._4_4_;
      auVar87._0_4_ = fVar233 * auVar100._0_4_;
      fVar236 = auVar73._8_4_;
      auVar87._8_4_ = fVar236 * auVar100._8_4_;
      fVar246 = auVar73._12_4_;
      auVar87._12_4_ = fVar246 * auVar100._12_4_;
      auVar87._16_4_ = auVar100._16_4_ * 0.0;
      auVar87._20_4_ = auVar100._20_4_ * 0.0;
      auVar87._24_4_ = auVar100._24_4_ * 0.0;
      auVar87._28_4_ = fVar224;
      auVar88._4_4_ = fVar234 * auVar101._4_4_;
      auVar88._0_4_ = fVar233 * auVar101._0_4_;
      auVar88._8_4_ = fVar236 * auVar101._8_4_;
      auVar88._12_4_ = fVar246 * auVar101._12_4_;
      auVar88._16_4_ = auVar101._16_4_ * 0.0;
      auVar88._20_4_ = auVar101._20_4_ * 0.0;
      auVar88._24_4_ = auVar101._24_4_ * 0.0;
      auVar88._28_4_ = auVar102._28_4_;
      auVar76 = vfmadd231ps_fma(auVar87,auVar104,ZEXT1632(auVar76));
      auVar72 = vfmadd231ps_fma(auVar88,auVar104,ZEXT1632(auVar72));
      auVar92._0_4_ = fVar233 * auVar89._0_4_;
      auVar92._4_4_ = fVar234 * auVar89._4_4_;
      auVar92._8_4_ = fVar236 * auVar89._8_4_;
      auVar92._12_4_ = fVar246 * auVar89._12_4_;
      auVar92._16_4_ = auVar89._16_4_ * 0.0;
      auVar92._20_4_ = auVar89._20_4_ * 0.0;
      auVar92._24_4_ = auVar89._24_4_ * 0.0;
      auVar92._28_4_ = 0;
      auVar102._4_4_ = fVar234 * auVar90._4_4_;
      auVar102._0_4_ = fVar233 * auVar90._0_4_;
      auVar102._8_4_ = fVar236 * auVar90._8_4_;
      auVar102._12_4_ = fVar246 * auVar90._12_4_;
      auVar102._16_4_ = auVar90._16_4_ * 0.0;
      auVar102._20_4_ = auVar90._20_4_ * 0.0;
      auVar102._24_4_ = auVar90._24_4_ * 0.0;
      auVar102._28_4_ = auVar89._28_4_;
      auVar66 = vfmadd231ps_fma(auVar92,auVar104,auVar100);
      auVar68 = vfmadd231ps_fma(auVar102,auVar104,auVar101);
      auVar89._28_4_ = auVar101._28_4_;
      auVar89._0_28_ =
           ZEXT1628(CONCAT412(fVar246 * auVar68._12_4_,
                              CONCAT48(fVar236 * auVar68._8_4_,
                                       CONCAT44(fVar234 * auVar68._4_4_,fVar233 * auVar68._0_4_))));
      auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar246 * auVar66._12_4_,
                                                   CONCAT48(fVar236 * auVar66._8_4_,
                                                            CONCAT44(fVar234 * auVar66._4_4_,
                                                                     fVar233 * auVar66._0_4_)))),
                                auVar104,ZEXT1632(auVar76));
      auVar70 = vfmadd231ps_fma(auVar89,auVar104,ZEXT1632(auVar72));
      auVar102 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar76));
      auVar87 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar72));
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar102 = vmulps_avx512vl(auVar102,auVar88);
      auVar87 = vmulps_avx512vl(auVar87,auVar88);
      auVar100._0_4_ = fVar235 * auVar102._0_4_;
      auVar100._4_4_ = fVar235 * auVar102._4_4_;
      auVar100._8_4_ = fVar235 * auVar102._8_4_;
      auVar100._12_4_ = fVar235 * auVar102._12_4_;
      auVar100._16_4_ = fVar235 * auVar102._16_4_;
      auVar100._20_4_ = fVar235 * auVar102._20_4_;
      auVar100._24_4_ = fVar235 * auVar102._24_4_;
      auVar100._28_4_ = 0;
      auVar102 = vmulps_avx512vl(auVar106,auVar87);
      auVar72 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
      auVar87 = vpermt2ps_avx512vl(ZEXT1632(auVar69),_DAT_01feed00,ZEXT1632(auVar72));
      auVar89 = vpermt2ps_avx512vl(ZEXT1632(auVar70),_DAT_01feed00,ZEXT1632(auVar72));
      auVar145._0_4_ = auVar100._0_4_ + auVar69._0_4_;
      auVar145._4_4_ = auVar100._4_4_ + auVar69._4_4_;
      auVar145._8_4_ = auVar100._8_4_ + auVar69._8_4_;
      auVar145._12_4_ = auVar100._12_4_ + auVar69._12_4_;
      auVar145._16_4_ = auVar100._16_4_ + 0.0;
      auVar145._20_4_ = auVar100._20_4_ + 0.0;
      auVar145._24_4_ = auVar100._24_4_ + 0.0;
      auVar145._28_4_ = 0;
      auVar101 = ZEXT1632(auVar72);
      auVar90 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar101);
      auVar91 = vaddps_avx512vl(ZEXT1632(auVar70),auVar102);
      auVar92 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar101);
      auVar102 = vsubps_avx(auVar87,auVar90);
      auVar92 = vsubps_avx512vl(auVar89,auVar92);
      auVar90 = vmulps_avx512vl(auVar96,auVar105);
      auVar100 = vmulps_avx512vl(auVar97,auVar105);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar104,auVar93);
      auVar93 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar95);
      auVar95 = vmulps_avx512vl(auVar103,auVar105);
      auVar100 = vmulps_avx512vl(auVar98,auVar105);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,auVar96);
      auVar96 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar97);
      auVar97 = vmulps_avx512vl(auVar99,auVar105);
      auVar94 = vmulps_avx512vl(auVar94,auVar105);
      auVar76 = vfmadd231ps_fma(auVar97,auVar104,auVar103);
      auVar103 = vfmadd231ps_avx512vl(auVar94,auVar104,auVar98);
      auVar94 = vmulps_avx512vl(auVar105,auVar95);
      auVar99 = ZEXT1632(auVar73);
      auVar97 = vmulps_avx512vl(auVar99,auVar96);
      auVar90 = vfmadd231ps_avx512vl(auVar94,auVar104,auVar90);
      auVar93 = vfmadd231ps_avx512vl(auVar97,auVar104,auVar93);
      auVar103 = vmulps_avx512vl(auVar99,auVar103);
      auVar94 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar246 * auVar76._12_4_,
                                              CONCAT48(fVar236 * auVar76._8_4_,
                                                       CONCAT44(fVar234 * auVar76._4_4_,
                                                                fVar233 * auVar76._0_4_)))),auVar104
                           ,auVar95);
      auVar95 = vfmadd231ps_avx512vl(auVar103,auVar104,auVar96);
      auVar103._4_4_ = fVar234 * auVar94._4_4_;
      auVar103._0_4_ = fVar233 * auVar94._0_4_;
      auVar103._8_4_ = fVar236 * auVar94._8_4_;
      auVar103._12_4_ = fVar246 * auVar94._12_4_;
      auVar103._16_4_ = auVar94._16_4_ * 0.0;
      auVar103._20_4_ = auVar94._20_4_ * 0.0;
      auVar103._24_4_ = auVar94._24_4_ * 0.0;
      auVar103._28_4_ = auVar98._28_4_;
      auVar96 = vmulps_avx512vl(auVar99,auVar95);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar104,auVar90);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar104);
      auVar104 = vsubps_avx512vl(auVar94,auVar90);
      auVar90 = vsubps_avx512vl(auVar95,auVar93);
      auVar93 = vmulps_avx512vl(auVar104,auVar88);
      auVar88 = vmulps_avx512vl(auVar90,auVar88);
      fVar224 = fVar235 * auVar93._0_4_;
      fVar233 = fVar235 * auVar93._4_4_;
      auVar104._4_4_ = fVar233;
      auVar104._0_4_ = fVar224;
      fVar234 = fVar235 * auVar93._8_4_;
      auVar104._8_4_ = fVar234;
      fVar236 = fVar235 * auVar93._12_4_;
      auVar104._12_4_ = fVar236;
      fVar246 = fVar235 * auVar93._16_4_;
      auVar104._16_4_ = fVar246;
      fVar247 = fVar235 * auVar93._20_4_;
      auVar104._20_4_ = fVar247;
      fVar235 = fVar235 * auVar93._24_4_;
      auVar104._24_4_ = fVar235;
      auVar104._28_4_ = auVar93._28_4_;
      auVar88 = vmulps_avx512vl(auVar106,auVar88);
      auVar94 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,auVar101);
      auVar95 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,auVar101);
      auVar223._0_4_ = auVar103._0_4_ + fVar224;
      auVar223._4_4_ = auVar103._4_4_ + fVar233;
      auVar223._8_4_ = auVar103._8_4_ + fVar234;
      auVar223._12_4_ = auVar103._12_4_ + fVar236;
      auVar223._16_4_ = auVar103._16_4_ + fVar246;
      auVar223._20_4_ = auVar103._20_4_ + fVar247;
      auVar223._24_4_ = auVar103._24_4_ + fVar235;
      auVar223._28_4_ = auVar103._28_4_ + auVar93._28_4_;
      auVar104 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,ZEXT1632(auVar72));
      auVar93 = vaddps_avx512vl(auVar96,auVar88);
      auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,ZEXT1632(auVar72));
      auVar104 = vsubps_avx(auVar94,auVar104);
      auVar88 = vsubps_avx512vl(auVar95,auVar88);
      auVar164 = ZEXT1632(auVar69);
      auVar90 = vsubps_avx512vl(auVar103,auVar164);
      auVar176 = ZEXT1632(auVar70);
      auVar97 = vsubps_avx512vl(auVar96,auVar176);
      auVar98 = vsubps_avx512vl(auVar94,auVar87);
      auVar90 = vaddps_avx512vl(auVar90,auVar98);
      auVar98 = vsubps_avx512vl(auVar95,auVar89);
      auVar97 = vaddps_avx512vl(auVar97,auVar98);
      auVar98 = vmulps_avx512vl(auVar176,auVar90);
      auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar164,auVar97);
      auVar99 = vmulps_avx512vl(auVar91,auVar90);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar145,auVar97);
      auVar100 = vmulps_avx512vl(auVar92,auVar90);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar102,auVar97);
      auVar101 = vmulps_avx512vl(auVar89,auVar90);
      auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar87,auVar97);
      auVar105 = vmulps_avx512vl(auVar96,auVar90);
      auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar103,auVar97);
      auVar106 = vmulps_avx512vl(auVar93,auVar90);
      auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar223,auVar97);
      auVar107 = vmulps_avx512vl(auVar88,auVar90);
      auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar104,auVar97);
      auVar90 = vmulps_avx512vl(auVar95,auVar90);
      auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar94,auVar97);
      auVar97 = vminps_avx512vl(auVar98,auVar99);
      auVar98 = vmaxps_avx512vl(auVar98,auVar99);
      auVar99 = vminps_avx512vl(auVar100,auVar101);
      auVar97 = vminps_avx512vl(auVar97,auVar99);
      auVar99 = vmaxps_avx512vl(auVar100,auVar101);
      auVar98 = vmaxps_avx512vl(auVar98,auVar99);
      auVar99 = vminps_avx512vl(auVar105,auVar106);
      auVar100 = vmaxps_avx512vl(auVar105,auVar106);
      auVar101 = vminps_avx512vl(auVar107,auVar90);
      auVar99 = vminps_avx512vl(auVar99,auVar101);
      auVar97 = vminps_avx512vl(auVar97,auVar99);
      auVar90 = vmaxps_avx512vl(auVar107,auVar90);
      auVar90 = vmaxps_avx512vl(auVar100,auVar90);
      auVar98 = vmaxps_avx512vl(auVar98,auVar90);
      auVar267 = ZEXT3264(auVar98);
      uVar21 = vcmpps_avx512vl(auVar97,local_3c0,2);
      auVar90._4_4_ = uStack_3dc;
      auVar90._0_4_ = local_3e0;
      auVar90._8_4_ = uStack_3d8;
      auVar90._12_4_ = uStack_3d4;
      auVar90._16_4_ = uStack_3d0;
      auVar90._20_4_ = uStack_3cc;
      auVar90._24_4_ = uStack_3c8;
      auVar90._28_4_ = uStack_3c4;
      uVar22 = vcmpps_avx512vl(auVar98,auVar90,5);
      bVar46 = (byte)uVar21 & (byte)uVar22 & 0x7f;
      if (bVar46 != 0) {
        auVar97 = vsubps_avx512vl(auVar87,auVar164);
        auVar98 = vsubps_avx512vl(auVar89,auVar176);
        auVar99 = vsubps_avx512vl(auVar94,auVar103);
        auVar97 = vaddps_avx512vl(auVar97,auVar99);
        auVar267 = ZEXT3264(auVar97);
        auVar99 = vsubps_avx512vl(auVar95,auVar96);
        auVar98 = vaddps_avx512vl(auVar98,auVar99);
        auVar99 = vmulps_avx512vl(auVar176,auVar97);
        auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar98,auVar164);
        auVar91 = vmulps_avx512vl(auVar91,auVar97);
        auVar91 = vfnmadd213ps_avx512vl(auVar145,auVar98,auVar91);
        auVar92 = vmulps_avx512vl(auVar92,auVar97);
        auVar92 = vfnmadd213ps_avx512vl(auVar102,auVar98,auVar92);
        auVar102 = vmulps_avx512vl(auVar89,auVar97);
        auVar89 = vfnmadd231ps_avx512vl(auVar102,auVar98,auVar87);
        auVar102 = vmulps_avx512vl(auVar96,auVar97);
        auVar96 = vfnmadd231ps_avx512vl(auVar102,auVar98,auVar103);
        auVar102 = vmulps_avx512vl(auVar93,auVar97);
        auVar93 = vfnmadd213ps_avx512vl(auVar223,auVar98,auVar102);
        auVar102 = vmulps_avx512vl(auVar88,auVar97);
        auVar100 = vfnmadd213ps_avx512vl(auVar104,auVar98,auVar102);
        auVar104 = vmulps_avx512vl(auVar95,auVar97);
        auVar94 = vfnmadd231ps_avx512vl(auVar104,auVar94,auVar98);
        auVar102 = vminps_avx(auVar99,auVar91);
        auVar104 = vmaxps_avx(auVar99,auVar91);
        auVar87 = vminps_avx(auVar92,auVar89);
        auVar87 = vminps_avx(auVar102,auVar87);
        auVar102 = vmaxps_avx(auVar92,auVar89);
        auVar104 = vmaxps_avx(auVar104,auVar102);
        auVar103 = vminps_avx(auVar96,auVar93);
        auVar102 = vmaxps_avx(auVar96,auVar93);
        auVar88 = vminps_avx(auVar100,auVar94);
        auVar103 = vminps_avx(auVar103,auVar88);
        auVar103 = vminps_avx(auVar87,auVar103);
        auVar87 = vmaxps_avx(auVar100,auVar94);
        auVar102 = vmaxps_avx(auVar102,auVar87);
        auVar104 = vmaxps_avx(auVar104,auVar102);
        uVar21 = vcmpps_avx512vl(auVar104,auVar90,5);
        uVar22 = vcmpps_avx512vl(auVar103,local_3c0,2);
        bVar46 = bVar46 & (byte)uVar21 & (byte)uVar22;
        if (bVar46 != 0) {
          auStack_610[uVar48] = (uint)bVar46;
          uVar21 = vmovlps_avx(auVar61);
          (&uStack_460)[uVar48] = uVar21;
          uVar53 = vmovlps_avx(auVar136);
          auStack_3a0[uVar48] = uVar53;
          uVar48 = (ulong)((int)uVar48 + 1);
        }
      }
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar268 = ZEXT3264(auVar104);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar269 = ZEXT1664(auVar61);
      auVar120._0_32_ = _DAT_01feed20;
      auVar270 = ZEXT3264(_DAT_01feed20);
      if ((int)uVar48 != 0) {
        do {
          auVar73 = SUB6416(ZEXT464(0xb8d1b717),0);
          auVar76 = auVar273._0_16_;
          uVar47 = (int)uVar48 - 1;
          uVar49 = (ulong)uVar47;
          uVar5 = auStack_610[uVar49];
          auVar136._8_8_ = 0;
          auVar136._0_8_ = auStack_3a0[uVar49];
          uVar53 = 0;
          for (uVar52 = (ulong)uVar5; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000)
          {
            uVar53 = uVar53 + 1;
          }
          uVar51 = uVar5 - 1 & uVar5;
          bVar57 = uVar51 == 0;
          auStack_610[uVar49] = uVar51;
          if (bVar57) {
            uVar48 = (ulong)uVar47;
          }
          auVar125._8_8_ = 0;
          auVar125._0_8_ = uVar53;
          auVar61 = vpunpcklqdq_avx(auVar125,ZEXT416((int)uVar53 + 1));
          auVar108._16_48_ = auVar120._16_48_;
          auVar61 = vcvtqq2ps_avx512vl(auVar61);
          auVar61 = vmulps_avx512vl(auVar61,auVar269._0_16_);
          uVar130 = *(undefined4 *)((long)&uStack_460 + uVar49 * 8 + 4);
          auVar23._4_4_ = uVar130;
          auVar23._0_4_ = uVar130;
          auVar23._8_4_ = uVar130;
          auVar23._12_4_ = uVar130;
          auVar72 = vmulps_avx512vl(auVar61,auVar23);
          auVar66 = auVar272._0_16_;
          auVar61 = vsubps_avx512vl(auVar66,auVar61);
          uVar130 = *(undefined4 *)(&uStack_460 + uVar49);
          auVar24._4_4_ = uVar130;
          auVar24._0_4_ = uVar130;
          auVar24._8_4_ = uVar130;
          auVar24._12_4_ = uVar130;
          auVar61 = vfmadd231ps_avx512vl(auVar72,auVar61,auVar24);
          auVar72 = vmovshdup_avx(auVar61);
          fVar235 = auVar72._0_4_ - auVar61._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar235));
          if (uVar5 == 0 || bVar57) goto LAB_01ae898a;
          auVar72 = vshufps_avx(auVar136,auVar136,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar235));
          uVar47 = (uint)uVar48;
          bVar55 = uVar47 < 4;
          bVar58 = uVar47 - 4 == 0;
          bVar56 = (POPCOUNT(uVar47 - 4 & 0xff) & 1U) == 0;
          auVar69 = vsubps_avx512vl(auVar66,auVar72);
          fVar224 = auVar72._0_4_;
          auVar171._0_4_ = fVar224 * fVar138;
          fVar233 = auVar72._4_4_;
          auVar171._4_4_ = fVar233 * fVar146;
          fVar234 = auVar72._8_4_;
          auVar171._8_4_ = fVar234 * fVar138;
          fVar236 = auVar72._12_4_;
          auVar171._12_4_ = fVar236 * fVar146;
          auVar185._0_4_ = fVar224 * fVar147;
          auVar185._4_4_ = fVar233 * fVar148;
          auVar185._8_4_ = fVar234 * fVar147;
          auVar185._12_4_ = fVar236 * fVar148;
          auVar192._0_4_ = fVar224 * fVar159;
          auVar192._4_4_ = fVar233 * fVar165;
          auVar192._8_4_ = fVar234 * fVar159;
          auVar192._12_4_ = fVar236 * fVar165;
          auVar154._0_4_ = fVar224 * fVar166;
          auVar154._4_4_ = fVar233 * fVar167;
          auVar154._8_4_ = fVar234 * fVar166;
          auVar154._12_4_ = fVar236 * fVar167;
          auVar70 = vfmadd231ps_avx512vl(auVar171,auVar69,auVar76);
          auVar72 = vfmadd231ps_fma(auVar185,auVar69,auVar62);
          auVar68 = vfmadd231ps_fma(auVar192,auVar69,auVar75);
          auVar69 = vfmadd231ps_fma(auVar154,auVar69,auVar74);
          auVar94._16_16_ = auVar70;
          auVar94._0_16_ = auVar70;
          auVar95._16_16_ = auVar72;
          auVar95._0_16_ = auVar72;
          auVar97._16_16_ = auVar68;
          auVar97._0_16_ = auVar68;
          auVar273._32_32_ = auVar120._32_32_;
          auVar102 = vpermps_avx512vl(auVar270._0_32_,ZEXT1632(auVar61));
          auVar104 = vsubps_avx(auVar95,auVar94);
          auVar70 = vfmadd213ps_fma(auVar104,auVar102,auVar94);
          auVar104 = vsubps_avx(auVar97,auVar95);
          auVar71 = vfmadd213ps_fma(auVar104,auVar102,auVar95);
          auVar72 = vsubps_avx(auVar69,auVar68);
          auVar96._16_16_ = auVar72;
          auVar96._0_16_ = auVar72;
          auVar72 = vfmadd213ps_fma(auVar96,auVar102,auVar97);
          auVar104 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar70));
          auVar68 = vfmadd213ps_fma(auVar104,auVar102,ZEXT1632(auVar70));
          auVar104 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar71));
          auVar72 = vfmadd213ps_fma(auVar104,auVar102,ZEXT1632(auVar71));
          auVar104 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar68));
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar104,auVar102);
          auVar273._0_32_ = vmulps_avx512vl(auVar104,auVar268._0_32_);
          auVar108._16_48_ = auVar273._16_48_;
          auVar72 = vmulss_avx512f(ZEXT416((uint)fVar235),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar224 = auVar72._0_4_;
          auVar193._0_8_ =
               CONCAT44(auVar160._4_4_ + fVar224 * auVar273._4_4_,
                        auVar160._0_4_ + fVar224 * auVar273._0_4_);
          auVar193._8_4_ = auVar160._8_4_ + fVar224 * auVar273._8_4_;
          auVar193._12_4_ = auVar160._12_4_ + fVar224 * auVar273._12_4_;
          auVar172._0_4_ = fVar224 * auVar273._16_4_;
          auVar172._4_4_ = fVar224 * auVar273._20_4_;
          auVar172._8_4_ = fVar224 * auVar273._24_4_;
          auVar172._12_4_ = fVar224 * auVar273._28_4_;
          auVar82 = vsubps_avx((undefined1  [16])0x0,auVar172);
          auVar71 = vshufpd_avx(auVar160,auVar160,3);
          auVar83 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar72 = vsubps_avx(auVar71,auVar160);
          auVar68 = vsubps_avx(auVar83,(undefined1  [16])0x0);
          auVar212._0_4_ = auVar72._0_4_ + auVar68._0_4_;
          auVar212._4_4_ = auVar72._4_4_ + auVar68._4_4_;
          auVar212._8_4_ = auVar72._8_4_ + auVar68._8_4_;
          auVar212._12_4_ = auVar72._12_4_ + auVar68._12_4_;
          auVar72 = vshufps_avx(auVar160,auVar160,0xb1);
          auVar68 = vshufps_avx(auVar193,auVar193,0xb1);
          auVar69 = vshufps_avx(auVar82,auVar82,0xb1);
          auVar70 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar260._4_4_ = auVar212._0_4_;
          auVar260._0_4_ = auVar212._0_4_;
          auVar260._8_4_ = auVar212._0_4_;
          auVar260._12_4_ = auVar212._0_4_;
          auVar79 = vshufps_avx(auVar212,auVar212,0x55);
          fVar224 = auVar79._0_4_;
          auVar221._0_4_ = auVar72._0_4_ * fVar224;
          fVar233 = auVar79._4_4_;
          auVar221._4_4_ = auVar72._4_4_ * fVar233;
          fVar234 = auVar79._8_4_;
          auVar221._8_4_ = auVar72._8_4_ * fVar234;
          fVar236 = auVar79._12_4_;
          auVar221._12_4_ = auVar72._12_4_ * fVar236;
          auVar226._0_4_ = auVar68._0_4_ * fVar224;
          auVar226._4_4_ = auVar68._4_4_ * fVar233;
          auVar226._8_4_ = auVar68._8_4_ * fVar234;
          auVar226._12_4_ = auVar68._12_4_ * fVar236;
          auVar238._0_4_ = auVar69._0_4_ * fVar224;
          auVar238._4_4_ = auVar69._4_4_ * fVar233;
          auVar238._8_4_ = auVar69._8_4_ * fVar234;
          auVar238._12_4_ = auVar69._12_4_ * fVar236;
          auVar213._0_4_ = auVar70._0_4_ * fVar224;
          auVar213._4_4_ = auVar70._4_4_ * fVar233;
          auVar213._8_4_ = auVar70._8_4_ * fVar234;
          auVar213._12_4_ = auVar70._12_4_ * fVar236;
          auVar72 = vfmadd231ps_fma(auVar221,auVar260,auVar160);
          auVar68 = vfmadd231ps_fma(auVar226,auVar260,auVar193);
          auVar81 = vfmadd231ps_fma(auVar238,auVar260,auVar82);
          auVar86 = vfmadd231ps_fma(auVar213,(undefined1  [16])0x0,auVar260);
          auVar79 = vshufpd_avx(auVar72,auVar72,1);
          auVar80 = vshufpd_avx(auVar68,auVar68,1);
          auVar77 = vshufpd_avx512vl(auVar81,auVar81,1);
          auVar78 = vshufpd_avx512vl(auVar86,auVar86,1);
          auVar69 = vminss_avx(auVar72,auVar68);
          auVar72 = vmaxss_avx(auVar68,auVar72);
          auVar70 = vminss_avx(auVar81,auVar86);
          auVar68 = vmaxss_avx(auVar86,auVar81);
          auVar69 = vminss_avx(auVar69,auVar70);
          auVar72 = vmaxss_avx(auVar68,auVar72);
          auVar70 = vminss_avx(auVar79,auVar80);
          auVar68 = vmaxss_avx(auVar80,auVar79);
          auVar79 = vminss_avx512f(auVar77,auVar78);
          auVar80 = vmaxss_avx512f(auVar78,auVar77);
          vmaxss_avx(auVar80,auVar68);
          auVar68 = vminss_avx512f(auVar70,auVar79);
          vucomiss_avx512f(auVar69);
          if ((bVar55 || bVar58) ||
             (auVar70 = vucomiss_avx512f(auVar73), bVar59 = bVar58, bVar55 || bVar58)) {
            auVar70 = vucomiss_avx512f(auVar73);
            auVar79 = vucomiss_avx512f(auVar68);
            auVar72 = vucomiss_avx512f(auVar73);
            bVar59 = bVar55 || bVar58;
            bVar56 = bVar55 || bVar58;
            if (!bVar55 && !bVar58) goto LAB_01ae90ec;
            uVar21 = vcmpps_avx512vl(auVar69,auVar79,5);
            uVar22 = vcmpps_avx512vl(auVar68,auVar79,5);
            uVar51 = (uint)uVar21 & (uint)uVar22;
            bVar10 = (uVar51 & 1) == 0;
            bVar59 = (!bVar55 && !bVar58) && bVar10;
            bVar56 = (!bVar55 && !bVar58) && (uVar51 & 1) == 0;
            if ((!bVar55 && !bVar58) && bVar10) goto LAB_01ae90ec;
          }
          else {
LAB_01ae90ec:
            auVar79 = vxorps_avx512vl(auVar76,auVar76);
            vcmpss_avx512f(auVar69,auVar79,1);
            uVar21 = vcmpss_avx512f(auVar72,auVar79,1);
            bVar58 = (bool)((byte)uVar21 & 1);
            auVar108._0_16_ = auVar129._0_16_;
            auVar109._4_60_ = auVar108._4_60_;
            auVar109._0_4_ = (float)((uint)bVar58 * -0x40800000 + (uint)!bVar58 * auVar129._0_4_);
            vucomiss_avx512f(auVar109._0_16_);
            bVar56 = (bool)(!bVar59 | bVar56);
            bVar59 = bVar56 == false;
            auVar111._16_48_ = auVar108._16_48_;
            auVar111._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar110._4_60_ = auVar111._4_60_;
            auVar110._0_4_ = (uint)bVar56 * auVar79._0_4_ + (uint)!bVar56 * 0x7f800000;
            auVar76 = auVar110._0_16_;
            auVar113._16_48_ = auVar108._16_48_;
            auVar113._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar112._4_60_ = auVar113._4_60_;
            auVar112._0_4_ = (uint)bVar56 * auVar79._0_4_ + (uint)!bVar56 * -0x800000;
            auVar73 = auVar112._0_16_;
            auVar80 = vxorps_avx512vl(auVar267._0_16_,auVar267._0_16_);
            auVar267 = ZEXT1664(auVar80);
            uVar21 = vcmpss_avx512f(auVar68,auVar79,1);
            bVar58 = (bool)((byte)uVar21 & 1);
            auVar115._16_48_ = auVar108._16_48_;
            auVar115._0_16_ = auVar129._0_16_;
            auVar114._4_60_ = auVar115._4_60_;
            auVar114._0_4_ = (float)((uint)bVar58 * -0x40800000 + (uint)!bVar58 * auVar129._0_4_);
            vucomiss_avx512f(auVar114._0_16_);
            if ((bVar56) || (bVar59)) {
              auVar68 = vucomiss_avx512f(auVar69);
              if ((bVar56) || (bVar59)) {
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar79 = vxorps_avx512vl(auVar69,auVar29);
                auVar68 = vsubss_avx512f(auVar68,auVar69);
                auVar68 = vdivss_avx512f(auVar79,auVar68);
                auVar69 = vsubss_avx512f(ZEXT416(0x3f800000),auVar68);
                auVar69 = vfmadd213ss_avx512f(auVar69,auVar80,auVar68);
                auVar68 = auVar69;
              }
              else {
                auVar68 = vxorps_avx512vl(auVar68,auVar68);
                vucomiss_avx512f(auVar68);
                auVar69 = ZEXT416(0x3f800000);
                if ((bVar56) || (bVar59)) {
                  auVar69 = SUB6416(ZEXT464(0xff800000),0);
                  auVar68 = ZEXT416(0x7f800000);
                }
              }
              auVar76 = vminss_avx512f(auVar76,auVar68);
              auVar73 = vmaxss_avx(auVar69,auVar73);
            }
            auVar129 = ZEXT464(0x3f800000);
            uVar21 = vcmpss_avx512f(auVar70,auVar80,1);
            bVar56 = (bool)((byte)uVar21 & 1);
            auVar68 = auVar129._0_16_;
            fVar224 = (float)((uint)bVar56 * -0x40800000 + (uint)!bVar56 * 0x3f800000);
            if ((auVar109._0_4_ != fVar224) || (NAN(auVar109._0_4_) || NAN(fVar224))) {
              fVar234 = auVar70._0_4_;
              fVar233 = auVar72._0_4_;
              if ((fVar234 != fVar233) || (NAN(fVar234) || NAN(fVar233))) {
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar72 = vxorps_avx512vl(auVar72,auVar28);
                auVar214._0_4_ = auVar72._0_4_ / (fVar234 - fVar233);
                auVar214._4_12_ = auVar72._4_12_;
                auVar72 = vsubss_avx512f(auVar68,auVar214);
                auVar72 = vfmadd213ss_avx512f(auVar72,auVar80,auVar214);
                auVar69 = auVar72;
              }
              else if ((fVar233 != 0.0) ||
                      (auVar72 = auVar68, auVar69 = ZEXT816(0) << 0x40, NAN(fVar233))) {
                auVar72 = SUB6416(ZEXT464(0xff800000),0);
                auVar69 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar76 = vminss_avx(auVar76,auVar69);
              auVar73 = vmaxss_avx(auVar72,auVar73);
            }
            bVar56 = auVar114._0_4_ != fVar224;
            auVar72 = vminss_avx512f(auVar76,auVar68);
            auVar117._16_48_ = auVar108._16_48_;
            auVar117._0_16_ = auVar76;
            auVar116._4_60_ = auVar117._4_60_;
            auVar116._0_4_ = (uint)bVar56 * auVar72._0_4_ + (uint)!bVar56 * auVar76._0_4_;
            auVar76 = vmaxss_avx512f(auVar68,auVar73);
            auVar119._16_48_ = auVar108._16_48_;
            auVar119._0_16_ = auVar73;
            auVar118._4_60_ = auVar119._4_60_;
            auVar118._0_4_ = (uint)bVar56 * auVar76._0_4_ + (uint)!bVar56 * auVar73._0_4_;
            auVar73 = vmaxss_avx512f(auVar80,auVar116._0_16_);
            auVar76 = vminss_avx512f(auVar118._0_16_,auVar68);
            if (auVar73._0_4_ <= auVar76._0_4_) {
              auVar69 = vmaxss_avx512f(auVar80,ZEXT416((uint)(auVar73._0_4_ + -0.1)));
              auVar81 = vminss_avx512f(ZEXT416((uint)(auVar76._0_4_ + 0.1)),auVar68);
              auVar155._0_8_ = auVar160._0_8_;
              auVar155._8_8_ = auVar155._0_8_;
              auVar227._8_8_ = auVar193._0_8_;
              auVar227._0_8_ = auVar193._0_8_;
              auVar239._8_8_ = auVar82._0_8_;
              auVar239._0_8_ = auVar82._0_8_;
              auVar73 = vshufpd_avx(auVar193,auVar193,3);
              auVar76 = vshufpd_avx(auVar82,auVar82,3);
              auVar72 = vshufps_avx(auVar69,auVar81,0);
              auVar79 = vsubps_avx512vl(auVar66,auVar72);
              fVar224 = auVar72._0_4_;
              auVar186._0_4_ = fVar224 * auVar71._0_4_;
              fVar233 = auVar72._4_4_;
              auVar186._4_4_ = fVar233 * auVar71._4_4_;
              fVar234 = auVar72._8_4_;
              auVar186._8_4_ = fVar234 * auVar71._8_4_;
              fVar236 = auVar72._12_4_;
              auVar186._12_4_ = fVar236 * auVar71._12_4_;
              auVar194._0_4_ = fVar224 * auVar73._0_4_;
              auVar194._4_4_ = fVar233 * auVar73._4_4_;
              auVar194._8_4_ = fVar234 * auVar73._8_4_;
              auVar194._12_4_ = fVar236 * auVar73._12_4_;
              auVar263._0_4_ = auVar76._0_4_ * fVar224;
              auVar263._4_4_ = auVar76._4_4_ * fVar233;
              auVar263._8_4_ = auVar76._8_4_ * fVar234;
              auVar263._12_4_ = auVar76._12_4_ * fVar236;
              auVar173._0_4_ = fVar224 * auVar83._0_4_;
              auVar173._4_4_ = fVar233 * auVar83._4_4_;
              auVar173._8_4_ = fVar234 * auVar83._8_4_;
              auVar173._12_4_ = fVar236 * auVar83._12_4_;
              auVar70 = vfmadd231ps_fma(auVar186,auVar79,auVar155);
              auVar71 = vfmadd231ps_fma(auVar194,auVar79,auVar227);
              auVar83 = vfmadd231ps_fma(auVar263,auVar79,auVar239);
              auVar79 = vfmadd231ps_fma(auVar173,auVar79,ZEXT816(0));
              auVar76 = vsubss_avx512f(auVar68,auVar69);
              auVar73 = vmovshdup_avx(auVar136);
              auVar160 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar69._0_4_)),auVar136,
                                         auVar76);
              auVar76 = vsubss_avx512f(auVar68,auVar81);
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar81._0_4_)),auVar136,
                                        auVar76);
              auVar82 = vdivss_avx512f(auVar68,ZEXT416((uint)fVar235));
              auVar73 = vsubps_avx(auVar71,auVar70);
              auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar72 = vmulps_avx512vl(auVar73,auVar81);
              auVar73 = vsubps_avx(auVar83,auVar71);
              auVar69 = vmulps_avx512vl(auVar73,auVar81);
              auVar73 = vsubps_avx(auVar79,auVar83);
              auVar73 = vmulps_avx512vl(auVar73,auVar81);
              auVar76 = vminps_avx(auVar69,auVar73);
              auVar73 = vmaxps_avx(auVar69,auVar73);
              auVar76 = vminps_avx(auVar72,auVar76);
              auVar73 = vmaxps_avx(auVar72,auVar73);
              auVar72 = vshufpd_avx(auVar76,auVar76,3);
              auVar69 = vshufpd_avx(auVar73,auVar73,3);
              auVar76 = vminps_avx(auVar76,auVar72);
              auVar73 = vmaxps_avx(auVar73,auVar69);
              fVar235 = auVar82._0_4_;
              auVar215._0_4_ = auVar76._0_4_ * fVar235;
              auVar215._4_4_ = auVar76._4_4_ * fVar235;
              auVar215._8_4_ = auVar76._8_4_ * fVar235;
              auVar215._12_4_ = auVar76._12_4_ * fVar235;
              auVar201._0_4_ = fVar235 * auVar73._0_4_;
              auVar201._4_4_ = fVar235 * auVar73._4_4_;
              auVar201._8_4_ = fVar235 * auVar73._8_4_;
              auVar201._12_4_ = fVar235 * auVar73._12_4_;
              auVar82 = vdivss_avx512f(auVar68,ZEXT416((uint)(auVar77._0_4_ - auVar160._0_4_)));
              auVar73 = vshufpd_avx(auVar70,auVar70,3);
              auVar76 = vshufpd_avx(auVar71,auVar71,3);
              auVar72 = vshufpd_avx(auVar83,auVar83,3);
              auVar69 = vshufpd_avx(auVar79,auVar79,3);
              auVar73 = vsubps_avx(auVar73,auVar70);
              auVar70 = vsubps_avx(auVar76,auVar71);
              auVar71 = vsubps_avx(auVar72,auVar83);
              auVar69 = vsubps_avx(auVar69,auVar79);
              auVar76 = vminps_avx(auVar73,auVar70);
              auVar73 = vmaxps_avx(auVar73,auVar70);
              auVar72 = vminps_avx(auVar71,auVar69);
              auVar72 = vminps_avx(auVar76,auVar72);
              auVar76 = vmaxps_avx(auVar71,auVar69);
              auVar73 = vmaxps_avx(auVar73,auVar76);
              fVar235 = auVar82._0_4_;
              auVar240._0_4_ = fVar235 * auVar72._0_4_;
              auVar240._4_4_ = fVar235 * auVar72._4_4_;
              auVar240._8_4_ = fVar235 * auVar72._8_4_;
              auVar240._12_4_ = fVar235 * auVar72._12_4_;
              auVar228._0_4_ = fVar235 * auVar73._0_4_;
              auVar228._4_4_ = fVar235 * auVar73._4_4_;
              auVar228._8_4_ = fVar235 * auVar73._8_4_;
              auVar228._12_4_ = fVar235 * auVar73._12_4_;
              auVar69 = vinsertps_avx(auVar61,auVar160,0x10);
              auVar78 = vpermt2ps_avx512vl(auVar61,_DAT_01feecd0,auVar77);
              auVar137._0_4_ = auVar69._0_4_ + auVar78._0_4_;
              auVar137._4_4_ = auVar69._4_4_ + auVar78._4_4_;
              auVar137._8_4_ = auVar69._8_4_ + auVar78._8_4_;
              auVar137._12_4_ = auVar69._12_4_ + auVar78._12_4_;
              auVar25._8_4_ = 0x3f000000;
              auVar25._0_8_ = 0x3f0000003f000000;
              auVar25._12_4_ = 0x3f000000;
              auVar82 = vmulps_avx512vl(auVar137,auVar25);
              auVar76 = vshufps_avx(auVar82,auVar82,0x54);
              uVar130 = auVar82._0_4_;
              auVar144._4_4_ = uVar130;
              auVar144._0_4_ = uVar130;
              auVar144._8_4_ = uVar130;
              auVar144._12_4_ = uVar130;
              auVar71 = vfmadd213ps_avx512vl(local_490,auVar144,auVar63);
              auVar72 = vfmadd213ps_fma(local_4a0,auVar144,local_620);
              auVar70 = vfmadd213ps_fma(local_4b0,auVar144,local_630);
              auVar73 = vsubps_avx(auVar72,auVar71);
              auVar71 = vfmadd213ps_fma(auVar73,auVar144,auVar71);
              auVar73 = vsubps_avx(auVar70,auVar72);
              auVar73 = vfmadd213ps_fma(auVar73,auVar144,auVar72);
              auVar73 = vsubps_avx(auVar73,auVar71);
              auVar72 = vfmadd231ps_fma(auVar71,auVar73,auVar144);
              auVar83 = vmulps_avx512vl(auVar73,auVar81);
              auVar252._8_8_ = auVar72._0_8_;
              auVar252._0_8_ = auVar72._0_8_;
              auVar73 = vshufpd_avx(auVar72,auVar72,3);
              auVar72 = vshufps_avx(auVar82,auVar82,0x55);
              auVar70 = vsubps_avx(auVar73,auVar252);
              auVar71 = vfmadd231ps_fma(auVar252,auVar72,auVar70);
              auVar264._8_8_ = auVar83._0_8_;
              auVar264._0_8_ = auVar83._0_8_;
              auVar73 = vshufpd_avx(auVar83,auVar83,3);
              auVar73 = vsubps_avx512vl(auVar73,auVar264);
              auVar73 = vfmadd213ps_avx512vl(auVar73,auVar72,auVar264);
              auVar72 = vxorps_avx512vl(auVar70,auVar274._0_16_);
              auVar83 = vmovshdup_avx512vl(auVar73);
              auVar79 = vxorps_avx512vl(auVar83,auVar274._0_16_);
              auVar81 = vmovshdup_avx512vl(auVar70);
              auVar79 = vpermt2ps_avx512vl(auVar79,ZEXT416(5),auVar70);
              auVar70 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar83._0_4_ * auVar70._0_4_)),auVar73,
                                            auVar81);
              auVar72 = vpermt2ps_avx512vl(auVar73,SUB6416(ZEXT464(4),0),auVar72);
              auVar174._0_4_ = auVar70._0_4_;
              auVar174._4_4_ = auVar174._0_4_;
              auVar174._8_4_ = auVar174._0_4_;
              auVar174._12_4_ = auVar174._0_4_;
              auVar73 = vdivps_avx(auVar79,auVar174);
              auVar84 = vdivps_avx512vl(auVar72,auVar174);
              fVar235 = auVar71._0_4_;
              auVar72 = vshufps_avx(auVar71,auVar71,0x55);
              auVar253._0_4_ = fVar235 * auVar73._0_4_ + auVar72._0_4_ * auVar84._0_4_;
              auVar253._4_4_ = fVar235 * auVar73._4_4_ + auVar72._4_4_ * auVar84._4_4_;
              auVar253._8_4_ = fVar235 * auVar73._8_4_ + auVar72._8_4_ * auVar84._8_4_;
              auVar253._12_4_ = fVar235 * auVar73._12_4_ + auVar72._12_4_ * auVar84._12_4_;
              auVar81 = vsubps_avx(auVar76,auVar253);
              auVar72 = vmovshdup_avx(auVar73);
              auVar76 = vinsertps_avx(auVar215,auVar240,0x1c);
              auVar265._0_4_ = auVar72._0_4_ * auVar76._0_4_;
              auVar265._4_4_ = auVar72._4_4_ * auVar76._4_4_;
              auVar265._8_4_ = auVar72._8_4_ * auVar76._8_4_;
              auVar265._12_4_ = auVar72._12_4_ * auVar76._12_4_;
              auVar86 = vinsertps_avx512f(auVar201,auVar228,0x1c);
              auVar72 = vmulps_avx512vl(auVar72,auVar86);
              auVar79 = vminps_avx512vl(auVar265,auVar72);
              auVar71 = vmaxps_avx(auVar72,auVar265);
              auVar83 = vmovshdup_avx(auVar84);
              auVar72 = vinsertps_avx(auVar240,auVar215,0x4c);
              auVar241._0_4_ = auVar83._0_4_ * auVar72._0_4_;
              auVar241._4_4_ = auVar83._4_4_ * auVar72._4_4_;
              auVar241._8_4_ = auVar83._8_4_ * auVar72._8_4_;
              auVar241._12_4_ = auVar83._12_4_ * auVar72._12_4_;
              auVar70 = vinsertps_avx(auVar228,auVar201,0x4c);
              auVar229._0_4_ = auVar83._0_4_ * auVar70._0_4_;
              auVar229._4_4_ = auVar83._4_4_ * auVar70._4_4_;
              auVar229._8_4_ = auVar83._8_4_ * auVar70._8_4_;
              auVar229._12_4_ = auVar83._12_4_ * auVar70._12_4_;
              auVar83 = vminps_avx(auVar241,auVar229);
              auVar79 = vaddps_avx512vl(auVar79,auVar83);
              auVar83 = vmaxps_avx(auVar229,auVar241);
              auVar230._0_4_ = auVar71._0_4_ + auVar83._0_4_;
              auVar230._4_4_ = auVar71._4_4_ + auVar83._4_4_;
              auVar230._8_4_ = auVar71._8_4_ + auVar83._8_4_;
              auVar230._12_4_ = auVar71._12_4_ + auVar83._12_4_;
              auVar242._8_8_ = 0x3f80000000000000;
              auVar242._0_8_ = 0x3f80000000000000;
              auVar71 = vsubps_avx(auVar242,auVar230);
              auVar83 = vsubps_avx(auVar242,auVar79);
              auVar79 = vsubps_avx(auVar69,auVar82);
              auVar82 = vsubps_avx(auVar78,auVar82);
              fVar236 = auVar79._0_4_;
              auVar266._0_4_ = fVar236 * auVar71._0_4_;
              fVar246 = auVar79._4_4_;
              auVar266._4_4_ = fVar246 * auVar71._4_4_;
              fVar247 = auVar79._8_4_;
              auVar266._8_4_ = fVar247 * auVar71._8_4_;
              fVar248 = auVar79._12_4_;
              auVar266._12_4_ = fVar248 * auVar71._12_4_;
              auVar85 = vbroadcastss_avx512vl(auVar73);
              auVar76 = vmulps_avx512vl(auVar85,auVar76);
              auVar86 = vmulps_avx512vl(auVar85,auVar86);
              auVar85 = vminps_avx512vl(auVar76,auVar86);
              auVar86 = vmaxps_avx512vl(auVar86,auVar76);
              auVar76 = vbroadcastss_avx512vl(auVar84);
              auVar72 = vmulps_avx512vl(auVar76,auVar72);
              auVar76 = vmulps_avx512vl(auVar76,auVar70);
              auVar70 = vminps_avx512vl(auVar72,auVar76);
              auVar70 = vaddps_avx512vl(auVar85,auVar70);
              auVar79 = vmulps_avx512vl(auVar79,auVar83);
              fVar235 = auVar82._0_4_;
              auVar231._0_4_ = fVar235 * auVar71._0_4_;
              fVar224 = auVar82._4_4_;
              auVar231._4_4_ = fVar224 * auVar71._4_4_;
              fVar233 = auVar82._8_4_;
              auVar231._8_4_ = fVar233 * auVar71._8_4_;
              fVar234 = auVar82._12_4_;
              auVar231._12_4_ = fVar234 * auVar71._12_4_;
              auVar243._0_4_ = fVar235 * auVar83._0_4_;
              auVar243._4_4_ = fVar224 * auVar83._4_4_;
              auVar243._8_4_ = fVar233 * auVar83._8_4_;
              auVar243._12_4_ = fVar234 * auVar83._12_4_;
              auVar76 = vmaxps_avx(auVar76,auVar72);
              auVar202._0_4_ = auVar86._0_4_ + auVar76._0_4_;
              auVar202._4_4_ = auVar86._4_4_ + auVar76._4_4_;
              auVar202._8_4_ = auVar86._8_4_ + auVar76._8_4_;
              auVar202._12_4_ = auVar86._12_4_ + auVar76._12_4_;
              auVar216._8_8_ = 0x3f800000;
              auVar216._0_8_ = 0x3f800000;
              auVar76 = vsubps_avx(auVar216,auVar202);
              auVar72 = vsubps_avx512vl(auVar216,auVar70);
              auVar261._0_4_ = fVar236 * auVar76._0_4_;
              auVar261._4_4_ = fVar246 * auVar76._4_4_;
              auVar261._8_4_ = fVar247 * auVar76._8_4_;
              auVar261._12_4_ = fVar248 * auVar76._12_4_;
              auVar254._0_4_ = fVar236 * auVar72._0_4_;
              auVar254._4_4_ = fVar246 * auVar72._4_4_;
              auVar254._8_4_ = fVar247 * auVar72._8_4_;
              auVar254._12_4_ = fVar248 * auVar72._12_4_;
              auVar203._0_4_ = fVar235 * auVar76._0_4_;
              auVar203._4_4_ = fVar224 * auVar76._4_4_;
              auVar203._8_4_ = fVar233 * auVar76._8_4_;
              auVar203._12_4_ = fVar234 * auVar76._12_4_;
              auVar217._0_4_ = fVar235 * auVar72._0_4_;
              auVar217._4_4_ = fVar224 * auVar72._4_4_;
              auVar217._8_4_ = fVar233 * auVar72._8_4_;
              auVar217._12_4_ = fVar234 * auVar72._12_4_;
              auVar76 = vminps_avx(auVar261,auVar254);
              auVar72 = vminps_avx512vl(auVar203,auVar217);
              auVar70 = vminps_avx512vl(auVar76,auVar72);
              auVar76 = vmaxps_avx(auVar254,auVar261);
              auVar72 = vmaxps_avx(auVar217,auVar203);
              auVar72 = vmaxps_avx(auVar72,auVar76);
              auVar71 = vminps_avx512vl(auVar266,auVar79);
              auVar76 = vminps_avx(auVar231,auVar243);
              auVar76 = vminps_avx(auVar71,auVar76);
              auVar76 = vhaddps_avx(auVar70,auVar76);
              auVar71 = vmaxps_avx512vl(auVar79,auVar266);
              auVar70 = vmaxps_avx(auVar243,auVar231);
              auVar70 = vmaxps_avx(auVar70,auVar71);
              auVar72 = vhaddps_avx(auVar72,auVar70);
              auVar76 = vshufps_avx(auVar76,auVar76,0xe8);
              auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
              auVar204._0_4_ = auVar76._0_4_ + auVar81._0_4_;
              auVar204._4_4_ = auVar76._4_4_ + auVar81._4_4_;
              auVar204._8_4_ = auVar76._8_4_ + auVar81._8_4_;
              auVar204._12_4_ = auVar76._12_4_ + auVar81._12_4_;
              auVar218._0_4_ = auVar72._0_4_ + auVar81._0_4_;
              auVar218._4_4_ = auVar72._4_4_ + auVar81._4_4_;
              auVar218._8_4_ = auVar72._8_4_ + auVar81._8_4_;
              auVar218._12_4_ = auVar72._12_4_ + auVar81._12_4_;
              auVar76 = vmaxps_avx(auVar69,auVar204);
              auVar72 = vminps_avx(auVar218,auVar78);
              uVar53 = vcmpps_avx512vl(auVar72,auVar76,1);
              if ((uVar53 & 3) == 0) {
                uVar53 = vcmpps_avx512vl(auVar218,auVar78,1);
                uVar21 = vcmpps_avx512vl(auVar61,auVar204,1);
                if (((ushort)uVar21 & (ushort)uVar53 & 1) == 0) {
                  bVar46 = 0;
                }
                else {
                  auVar76 = vmovshdup_avx(auVar204);
                  bVar46 = auVar160._0_4_ < auVar76._0_4_ & (byte)(uVar53 >> 1) & 0x7f;
                }
                if (((!bVar55 || uVar5 != 0 && !bVar57) | bVar46) != 1) {
                  auVar136 = vinsertps_avx(auVar160,auVar77,0x10);
                  auVar273 = ZEXT1664(local_640);
                  goto LAB_01ae898a;
                }
                lVar50 = 200;
                do {
                  auVar61 = vsubss_avx512f(auVar68,auVar81);
                  fVar233 = auVar61._0_4_;
                  fVar235 = fVar233 * fVar233 * fVar233;
                  auVar61 = vmulss_avx512f(auVar81,ZEXT416(0x40400000));
                  fVar224 = auVar61._0_4_ * fVar233 * fVar233;
                  fVar234 = auVar81._0_4_;
                  auVar72 = ZEXT416(0x40400000);
                  auVar61 = vmulss_avx512f(ZEXT416((uint)(fVar234 * fVar234)),auVar72);
                  fVar233 = fVar233 * auVar61._0_4_;
                  auVar162._4_4_ = fVar235;
                  auVar162._0_4_ = fVar235;
                  auVar162._8_4_ = fVar235;
                  auVar162._12_4_ = fVar235;
                  auVar156._4_4_ = fVar224;
                  auVar156._0_4_ = fVar224;
                  auVar156._8_4_ = fVar224;
                  auVar156._12_4_ = fVar224;
                  auVar126._4_4_ = fVar233;
                  auVar126._0_4_ = fVar233;
                  auVar126._8_4_ = fVar233;
                  auVar126._12_4_ = fVar233;
                  fVar234 = fVar234 * fVar234 * fVar234;
                  auVar187._0_4_ = (float)local_480._0_4_ * fVar234;
                  auVar187._4_4_ = (float)local_480._4_4_ * fVar234;
                  auVar187._8_4_ = fStack_478 * fVar234;
                  auVar187._12_4_ = fStack_474 * fVar234;
                  auVar61 = vfmadd231ps_fma(auVar187,local_630,auVar126);
                  auVar61 = vfmadd231ps_fma(auVar61,local_620,auVar156);
                  auVar61 = vfmadd231ps_fma(auVar61,auVar63,auVar162);
                  auVar127._8_8_ = auVar61._0_8_;
                  auVar127._0_8_ = auVar61._0_8_;
                  auVar61 = vshufpd_avx(auVar61,auVar61,3);
                  auVar76 = vshufps_avx(auVar81,auVar81,0x55);
                  auVar61 = vsubps_avx(auVar61,auVar127);
                  auVar76 = vfmadd213ps_fma(auVar61,auVar76,auVar127);
                  fVar235 = auVar76._0_4_;
                  auVar61 = vshufps_avx(auVar76,auVar76,0x55);
                  auVar128._0_4_ = auVar73._0_4_ * fVar235 + auVar84._0_4_ * auVar61._0_4_;
                  auVar128._4_4_ = auVar73._4_4_ * fVar235 + auVar84._4_4_ * auVar61._4_4_;
                  auVar128._8_4_ = auVar73._8_4_ * fVar235 + auVar84._8_4_ * auVar61._8_4_;
                  auVar128._12_4_ = auVar73._12_4_ * fVar235 + auVar84._12_4_ * auVar61._12_4_;
                  auVar81 = vsubps_avx(auVar81,auVar128);
                  auVar61 = vandps_avx512vl(auVar76,auVar271._0_16_);
                  auVar76 = vprolq_avx512vl(auVar61,0x20);
                  auVar61 = vmaxss_avx(auVar76,auVar61);
                  bVar57 = (float)local_470._0_4_ < auVar61._0_4_;
                  if (auVar61._0_4_ < (float)local_470._0_4_) {
                    auVar61 = vucomiss_avx512f(auVar80);
                    if (bVar57) break;
                    auVar73 = vucomiss_avx512f(auVar61);
                    auVar129 = ZEXT1664(auVar73);
                    if (bVar57) break;
                    vmovshdup_avx(auVar61);
                    auVar73 = vucomiss_avx512f(auVar80);
                    if (bVar57) break;
                    auVar76 = vucomiss_avx512f(auVar73);
                    auVar129 = ZEXT1664(auVar76);
                    if (bVar57) break;
                    auVar68 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar82 = vinsertps_avx(auVar68,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar68 = vdpps_avx(auVar82,local_4c0,0x7f);
                    auVar69 = vdpps_avx(auVar82,local_4d0,0x7f);
                    auVar70 = vdpps_avx(auVar82,local_4e0,0x7f);
                    auVar71 = vdpps_avx(auVar82,local_4f0,0x7f);
                    auVar83 = vdpps_avx(auVar82,local_500,0x7f);
                    auVar79 = vdpps_avx(auVar82,local_510,0x7f);
                    auVar80 = vdpps_avx(auVar82,local_520,0x7f);
                    auVar82 = vdpps_avx(auVar82,local_530,0x7f);
                    auVar81 = vsubss_avx512f(auVar76,auVar73);
                    fVar236 = auVar73._0_4_;
                    auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar83._0_4_)),auVar81,
                                              auVar68);
                    auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * fVar236)),auVar81,
                                              auVar69);
                    auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * fVar236)),auVar81,
                                              auVar70);
                    auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar82._0_4_)),auVar81,
                                              auVar71);
                    auVar76 = vsubss_avx512f(auVar76,auVar61);
                    auVar195._0_4_ = auVar76._0_4_;
                    fVar224 = auVar195._0_4_ * auVar195._0_4_ * auVar195._0_4_;
                    auVar76 = vmulss_avx512f(auVar61,auVar72);
                    fVar233 = auVar76._0_4_ * auVar195._0_4_ * auVar195._0_4_;
                    fVar235 = auVar61._0_4_;
                    auVar188._0_4_ = fVar235 * fVar235;
                    auVar188._4_4_ = auVar61._4_4_ * auVar61._4_4_;
                    auVar188._8_4_ = auVar61._8_4_ * auVar61._8_4_;
                    auVar188._12_4_ = auVar61._12_4_ * auVar61._12_4_;
                    auVar76 = vmulss_avx512f(auVar188,auVar72);
                    fVar234 = auVar195._0_4_ * auVar76._0_4_;
                    fVar247 = fVar235 * auVar188._0_4_;
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * auVar70._0_4_)),
                                              ZEXT416((uint)fVar234),auVar69);
                    auVar76 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar233),auVar68);
                    auVar73 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar224),auVar73);
                    fVar246 = auVar73._0_4_;
                    if ((fVar246 < fVar122) ||
                       (fVar248 = *(float *)(ray + k * 4 + 0x200), fVar248 < fVar246)) break;
                    auVar73 = vshufps_avx(auVar61,auVar61,0x55);
                    auVar66 = vsubps_avx512vl(auVar66,auVar73);
                    fVar249 = auVar73._0_4_;
                    auVar222._0_4_ = fVar249 * (float)local_550._0_4_;
                    fVar255 = auVar73._4_4_;
                    auVar222._4_4_ = fVar255 * (float)local_550._4_4_;
                    fVar256 = auVar73._8_4_;
                    auVar222._8_4_ = fVar256 * fStack_548;
                    fVar257 = auVar73._12_4_;
                    auVar222._12_4_ = fVar257 * fStack_544;
                    auVar232._0_4_ = fVar249 * (float)local_5a0._0_4_;
                    auVar232._4_4_ = fVar255 * (float)local_5a0._4_4_;
                    auVar232._8_4_ = fVar256 * fStack_598;
                    auVar232._12_4_ = fVar257 * fStack_594;
                    auVar244._0_4_ = fVar249 * (float)local_5b0._0_4_;
                    auVar244._4_4_ = fVar255 * (float)local_5b0._4_4_;
                    auVar244._8_4_ = fVar256 * fStack_5a8;
                    auVar244._12_4_ = fVar257 * fStack_5a4;
                    auVar205._0_4_ = fVar249 * (float)local_570._0_4_;
                    auVar205._4_4_ = fVar255 * (float)local_570._4_4_;
                    auVar205._8_4_ = fVar256 * fStack_568;
                    auVar205._12_4_ = fVar257 * fStack_564;
                    auVar73 = vfmadd231ps_fma(auVar222,auVar66,local_540);
                    auVar76 = vfmadd231ps_fma(auVar232,auVar66,local_580);
                    auVar72 = vfmadd231ps_fma(auVar244,auVar66,local_590);
                    auVar66 = vfmadd231ps_fma(auVar205,auVar66,local_560);
                    auVar73 = vsubps_avx(auVar76,auVar73);
                    auVar76 = vsubps_avx(auVar72,auVar76);
                    auVar72 = vsubps_avx(auVar66,auVar72);
                    auVar245._0_4_ = fVar235 * auVar76._0_4_;
                    auVar245._4_4_ = fVar235 * auVar76._4_4_;
                    auVar245._8_4_ = fVar235 * auVar76._8_4_;
                    auVar245._12_4_ = fVar235 * auVar76._12_4_;
                    auVar195._4_4_ = auVar195._0_4_;
                    auVar195._8_4_ = auVar195._0_4_;
                    auVar195._12_4_ = auVar195._0_4_;
                    auVar73 = vfmadd231ps_fma(auVar245,auVar195,auVar73);
                    auVar206._0_4_ = fVar235 * auVar72._0_4_;
                    auVar206._4_4_ = fVar235 * auVar72._4_4_;
                    auVar206._8_4_ = fVar235 * auVar72._8_4_;
                    auVar206._12_4_ = fVar235 * auVar72._12_4_;
                    auVar76 = vfmadd231ps_fma(auVar206,auVar195,auVar76);
                    auVar207._0_4_ = fVar235 * auVar76._0_4_;
                    auVar207._4_4_ = fVar235 * auVar76._4_4_;
                    auVar207._8_4_ = fVar235 * auVar76._8_4_;
                    auVar207._12_4_ = fVar235 * auVar76._12_4_;
                    auVar73 = vfmadd231ps_fma(auVar207,auVar195,auVar73);
                    auVar27._8_4_ = 0x40400000;
                    auVar27._0_8_ = 0x4040000040400000;
                    auVar27._12_4_ = 0x40400000;
                    auVar73 = vmulps_avx512vl(auVar73,auVar27);
                    pGVar6 = (context->scene->geometries).items[uVar54].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    auVar189._0_4_ = fVar247 * (float)local_5f0._0_4_;
                    auVar189._4_4_ = fVar247 * (float)local_5f0._4_4_;
                    auVar189._8_4_ = fVar247 * fStack_5e8;
                    auVar189._12_4_ = fVar247 * fStack_5e4;
                    auVar175._4_4_ = fVar234;
                    auVar175._0_4_ = fVar234;
                    auVar175._8_4_ = fVar234;
                    auVar175._12_4_ = fVar234;
                    auVar76 = vfmadd132ps_fma(auVar175,auVar189,local_5e0);
                    auVar163._4_4_ = fVar233;
                    auVar163._0_4_ = fVar233;
                    auVar163._8_4_ = fVar233;
                    auVar163._12_4_ = fVar233;
                    auVar76 = vfmadd132ps_fma(auVar163,auVar76,local_5d0);
                    auVar157._4_4_ = fVar224;
                    auVar157._0_4_ = fVar224;
                    auVar157._8_4_ = fVar224;
                    auVar157._12_4_ = fVar224;
                    auVar66 = vfmadd132ps_fma(auVar157,auVar76,local_5c0);
                    auVar76 = vshufps_avx(auVar66,auVar66,0xc9);
                    auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar158._0_4_ = auVar66._0_4_ * auVar72._0_4_;
                    auVar158._4_4_ = auVar66._4_4_ * auVar72._4_4_;
                    auVar158._8_4_ = auVar66._8_4_ * auVar72._8_4_;
                    auVar158._12_4_ = auVar66._12_4_ * auVar72._12_4_;
                    auVar73 = vfmsub231ps_fma(auVar158,auVar73,auVar76);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar246;
                      uVar130 = vextractps_avx(auVar73,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar130;
                      uVar130 = vextractps_avx(auVar73,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar130;
                      *(int *)(ray + k * 4 + 0x380) = auVar73._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar235;
                      *(float *)(ray + k * 4 + 0x400) = fVar236;
                      *(uint *)(ray + k * 4 + 0x440) = uVar4;
                      *(uint *)(ray + k * 4 + 0x480) = uVar54;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    local_200 = vbroadcastss_avx512f(auVar61);
                    auVar108 = vbroadcastss_avx512f(ZEXT416(1));
                    local_1c0 = vpermps_avx512f(auVar108,ZEXT1664(auVar61));
                    auVar108 = vpermps_avx512f(auVar108,ZEXT1664(auVar73));
                    auVar273 = vbroadcastss_avx512f(ZEXT416(2));
                    local_280 = vpermps_avx512f(auVar273,ZEXT1664(auVar73));
                    local_240 = vbroadcastss_avx512f(auVar73);
                    local_2c0[0] = (RTCHitN)auVar108[0];
                    local_2c0[1] = (RTCHitN)auVar108[1];
                    local_2c0[2] = (RTCHitN)auVar108[2];
                    local_2c0[3] = (RTCHitN)auVar108[3];
                    local_2c0[4] = (RTCHitN)auVar108[4];
                    local_2c0[5] = (RTCHitN)auVar108[5];
                    local_2c0[6] = (RTCHitN)auVar108[6];
                    local_2c0[7] = (RTCHitN)auVar108[7];
                    local_2c0[8] = (RTCHitN)auVar108[8];
                    local_2c0[9] = (RTCHitN)auVar108[9];
                    local_2c0[10] = (RTCHitN)auVar108[10];
                    local_2c0[0xb] = (RTCHitN)auVar108[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar108[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar108[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar108[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar108[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar108[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar108[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar108[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar108[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar108[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar108[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar108[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar108[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar108[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar108[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar108[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar108[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar108[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar108[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar108[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar108[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar108[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar108[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar108[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar108[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar108[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar108[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar108[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar108[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar108[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar108[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar108[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar108[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar108[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar108[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar108[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar108[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar108[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar108[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar108[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar108[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar108[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar108[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar108[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar108[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar108[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar108[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar108[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar108[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar108[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar108[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar108[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar108[0x3f];
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar108 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar108);
                    vpcmpeqd_avx2(auVar108._0_32_,auVar108._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar246;
                    auVar108 = vmovdqa64_avx512f(local_380);
                    local_440 = vmovdqa64_avx512f(auVar108);
                    local_670.valid = (int *)local_440;
                    local_670.geometryUserPtr = pGVar6->userPtr;
                    local_670.context = context->user;
                    local_670.hit = local_2c0;
                    local_670.N = 0x10;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->intersectionFilterN)(&local_670);
                      auVar129 = ZEXT464(0x3f800000);
                      auVar270 = ZEXT3264(_DAT_01feed20);
                      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar269 = ZEXT1664(auVar61);
                      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar268 = ZEXT3264(auVar104);
                      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar274 = ZEXT1664(auVar61);
                      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar272 = ZEXT1664(auVar61);
                      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar271 = ZEXT1664(auVar61);
                      auVar108 = vmovdqa64_avx512f(local_440);
                    }
                    uVar21 = vptestmd_avx512f(auVar108,auVar108);
                    if ((short)uVar21 != 0) {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&local_670);
                        auVar129 = ZEXT464(0x3f800000);
                        auVar270 = ZEXT3264(_DAT_01feed20);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar269 = ZEXT1664(auVar61);
                        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar268 = ZEXT3264(auVar104);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar274 = ZEXT1664(auVar61);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar272 = ZEXT1664(auVar61);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar271 = ZEXT1664(auVar61);
                        auVar108 = vmovdqa64_avx512f(local_440);
                      }
                      uVar53 = vptestmd_avx512f(auVar108,auVar108);
                      if ((short)uVar53 != 0) {
                        iVar31 = *(int *)(local_670.hit + 4);
                        iVar32 = *(int *)(local_670.hit + 8);
                        iVar33 = *(int *)(local_670.hit + 0xc);
                        iVar34 = *(int *)(local_670.hit + 0x10);
                        iVar35 = *(int *)(local_670.hit + 0x14);
                        iVar36 = *(int *)(local_670.hit + 0x18);
                        iVar37 = *(int *)(local_670.hit + 0x1c);
                        iVar38 = *(int *)(local_670.hit + 0x20);
                        iVar39 = *(int *)(local_670.hit + 0x24);
                        iVar40 = *(int *)(local_670.hit + 0x28);
                        iVar41 = *(int *)(local_670.hit + 0x2c);
                        iVar42 = *(int *)(local_670.hit + 0x30);
                        iVar43 = *(int *)(local_670.hit + 0x34);
                        iVar44 = *(int *)(local_670.hit + 0x38);
                        iVar45 = *(int *)(local_670.hit + 0x3c);
                        bVar46 = (byte)uVar53;
                        bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
                        bVar56 = (bool)((byte)(uVar53 >> 2) & 1);
                        bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
                        bVar58 = (bool)((byte)(uVar53 >> 4) & 1);
                        bVar59 = (bool)((byte)(uVar53 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar53 >> 7) & 1);
                        bVar12 = (byte)(uVar53 >> 8);
                        bVar13 = (bool)((byte)(uVar53 >> 9) & 1);
                        bVar14 = (bool)((byte)(uVar53 >> 10) & 1);
                        bVar15 = (bool)((byte)(uVar53 >> 0xb) & 1);
                        bVar16 = (bool)((byte)(uVar53 >> 0xc) & 1);
                        bVar17 = (bool)((byte)(uVar53 >> 0xd) & 1);
                        bVar18 = (bool)((byte)(uVar53 >> 0xe) & 1);
                        bVar19 = SUB81(uVar53 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x300) =
                             (uint)(bVar46 & 1) * *(int *)local_670.hit |
                             (uint)!(bool)(bVar46 & 1) * *(int *)(local_670.ray + 0x300);
                        *(uint *)(local_670.ray + 0x304) =
                             (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_670.ray + 0x304)
                        ;
                        *(uint *)(local_670.ray + 0x308) =
                             (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_670.ray + 0x308)
                        ;
                        *(uint *)(local_670.ray + 0x30c) =
                             (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_670.ray + 0x30c)
                        ;
                        *(uint *)(local_670.ray + 0x310) =
                             (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_670.ray + 0x310)
                        ;
                        *(uint *)(local_670.ray + 0x314) =
                             (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_670.ray + 0x314)
                        ;
                        *(uint *)(local_670.ray + 0x318) =
                             (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_670.ray + 0x318)
                        ;
                        *(uint *)(local_670.ray + 0x31c) =
                             (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_670.ray + 0x31c)
                        ;
                        *(uint *)(local_670.ray + 800) =
                             (uint)(bVar12 & 1) * iVar38 |
                             (uint)!(bool)(bVar12 & 1) * *(int *)(local_670.ray + 800);
                        *(uint *)(local_670.ray + 0x324) =
                             (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_670.ray + 0x324)
                        ;
                        *(uint *)(local_670.ray + 0x328) =
                             (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_670.ray + 0x328)
                        ;
                        *(uint *)(local_670.ray + 0x32c) =
                             (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_670.ray + 0x32c)
                        ;
                        *(uint *)(local_670.ray + 0x330) =
                             (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_670.ray + 0x330)
                        ;
                        *(uint *)(local_670.ray + 0x334) =
                             (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_670.ray + 0x334)
                        ;
                        *(uint *)(local_670.ray + 0x338) =
                             (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_670.ray + 0x338)
                        ;
                        *(uint *)(local_670.ray + 0x33c) =
                             (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_670.ray + 0x33c)
                        ;
                        iVar31 = *(int *)(local_670.hit + 0x44);
                        iVar32 = *(int *)(local_670.hit + 0x48);
                        iVar33 = *(int *)(local_670.hit + 0x4c);
                        iVar34 = *(int *)(local_670.hit + 0x50);
                        iVar35 = *(int *)(local_670.hit + 0x54);
                        iVar36 = *(int *)(local_670.hit + 0x58);
                        iVar37 = *(int *)(local_670.hit + 0x5c);
                        iVar38 = *(int *)(local_670.hit + 0x60);
                        iVar39 = *(int *)(local_670.hit + 100);
                        iVar40 = *(int *)(local_670.hit + 0x68);
                        iVar41 = *(int *)(local_670.hit + 0x6c);
                        iVar42 = *(int *)(local_670.hit + 0x70);
                        iVar43 = *(int *)(local_670.hit + 0x74);
                        iVar44 = *(int *)(local_670.hit + 0x78);
                        iVar45 = *(int *)(local_670.hit + 0x7c);
                        bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
                        bVar56 = (bool)((byte)(uVar53 >> 2) & 1);
                        bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
                        bVar58 = (bool)((byte)(uVar53 >> 4) & 1);
                        bVar59 = (bool)((byte)(uVar53 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar53 >> 7) & 1);
                        bVar13 = (bool)((byte)(uVar53 >> 9) & 1);
                        bVar14 = (bool)((byte)(uVar53 >> 10) & 1);
                        bVar15 = (bool)((byte)(uVar53 >> 0xb) & 1);
                        bVar16 = (bool)((byte)(uVar53 >> 0xc) & 1);
                        bVar17 = (bool)((byte)(uVar53 >> 0xd) & 1);
                        bVar18 = (bool)((byte)(uVar53 >> 0xe) & 1);
                        bVar19 = SUB81(uVar53 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x340) =
                             (uint)(bVar46 & 1) * *(int *)(local_670.hit + 0x40) |
                             (uint)!(bool)(bVar46 & 1) * *(int *)(local_670.ray + 0x340);
                        *(uint *)(local_670.ray + 0x344) =
                             (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_670.ray + 0x344)
                        ;
                        *(uint *)(local_670.ray + 0x348) =
                             (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_670.ray + 0x348)
                        ;
                        *(uint *)(local_670.ray + 0x34c) =
                             (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_670.ray + 0x34c)
                        ;
                        *(uint *)(local_670.ray + 0x350) =
                             (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_670.ray + 0x350)
                        ;
                        *(uint *)(local_670.ray + 0x354) =
                             (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_670.ray + 0x354)
                        ;
                        *(uint *)(local_670.ray + 0x358) =
                             (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_670.ray + 0x358)
                        ;
                        *(uint *)(local_670.ray + 0x35c) =
                             (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_670.ray + 0x35c)
                        ;
                        *(uint *)(local_670.ray + 0x360) =
                             (uint)(bVar12 & 1) * iVar38 |
                             (uint)!(bool)(bVar12 & 1) * *(int *)(local_670.ray + 0x360);
                        *(uint *)(local_670.ray + 0x364) =
                             (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_670.ray + 0x364)
                        ;
                        *(uint *)(local_670.ray + 0x368) =
                             (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_670.ray + 0x368)
                        ;
                        *(uint *)(local_670.ray + 0x36c) =
                             (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_670.ray + 0x36c)
                        ;
                        *(uint *)(local_670.ray + 0x370) =
                             (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_670.ray + 0x370)
                        ;
                        *(uint *)(local_670.ray + 0x374) =
                             (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_670.ray + 0x374)
                        ;
                        *(uint *)(local_670.ray + 0x378) =
                             (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_670.ray + 0x378)
                        ;
                        *(uint *)(local_670.ray + 0x37c) =
                             (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_670.ray + 0x37c)
                        ;
                        iVar31 = *(int *)(local_670.hit + 0x84);
                        iVar32 = *(int *)(local_670.hit + 0x88);
                        iVar33 = *(int *)(local_670.hit + 0x8c);
                        iVar34 = *(int *)(local_670.hit + 0x90);
                        iVar35 = *(int *)(local_670.hit + 0x94);
                        iVar36 = *(int *)(local_670.hit + 0x98);
                        iVar37 = *(int *)(local_670.hit + 0x9c);
                        iVar38 = *(int *)(local_670.hit + 0xa0);
                        iVar39 = *(int *)(local_670.hit + 0xa4);
                        iVar40 = *(int *)(local_670.hit + 0xa8);
                        iVar41 = *(int *)(local_670.hit + 0xac);
                        iVar42 = *(int *)(local_670.hit + 0xb0);
                        iVar43 = *(int *)(local_670.hit + 0xb4);
                        iVar44 = *(int *)(local_670.hit + 0xb8);
                        iVar45 = *(int *)(local_670.hit + 0xbc);
                        bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
                        bVar56 = (bool)((byte)(uVar53 >> 2) & 1);
                        bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
                        bVar58 = (bool)((byte)(uVar53 >> 4) & 1);
                        bVar59 = (bool)((byte)(uVar53 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar53 >> 7) & 1);
                        bVar13 = (bool)((byte)(uVar53 >> 9) & 1);
                        bVar14 = (bool)((byte)(uVar53 >> 10) & 1);
                        bVar15 = (bool)((byte)(uVar53 >> 0xb) & 1);
                        bVar16 = (bool)((byte)(uVar53 >> 0xc) & 1);
                        bVar17 = (bool)((byte)(uVar53 >> 0xd) & 1);
                        bVar18 = (bool)((byte)(uVar53 >> 0xe) & 1);
                        bVar19 = SUB81(uVar53 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x380) =
                             (uint)(bVar46 & 1) * *(int *)(local_670.hit + 0x80) |
                             (uint)!(bool)(bVar46 & 1) * *(int *)(local_670.ray + 0x380);
                        *(uint *)(local_670.ray + 900) =
                             (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_670.ray + 900);
                        *(uint *)(local_670.ray + 0x388) =
                             (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_670.ray + 0x388)
                        ;
                        *(uint *)(local_670.ray + 0x38c) =
                             (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_670.ray + 0x38c)
                        ;
                        *(uint *)(local_670.ray + 0x390) =
                             (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_670.ray + 0x390)
                        ;
                        *(uint *)(local_670.ray + 0x394) =
                             (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_670.ray + 0x394)
                        ;
                        *(uint *)(local_670.ray + 0x398) =
                             (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_670.ray + 0x398)
                        ;
                        *(uint *)(local_670.ray + 0x39c) =
                             (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_670.ray + 0x39c)
                        ;
                        *(uint *)(local_670.ray + 0x3a0) =
                             (uint)(bVar12 & 1) * iVar38 |
                             (uint)!(bool)(bVar12 & 1) * *(int *)(local_670.ray + 0x3a0);
                        *(uint *)(local_670.ray + 0x3a4) =
                             (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_670.ray + 0x3a4)
                        ;
                        *(uint *)(local_670.ray + 0x3a8) =
                             (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_670.ray + 0x3a8)
                        ;
                        *(uint *)(local_670.ray + 0x3ac) =
                             (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_670.ray + 0x3ac)
                        ;
                        *(uint *)(local_670.ray + 0x3b0) =
                             (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_670.ray + 0x3b0)
                        ;
                        *(uint *)(local_670.ray + 0x3b4) =
                             (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_670.ray + 0x3b4)
                        ;
                        *(uint *)(local_670.ray + 0x3b8) =
                             (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_670.ray + 0x3b8)
                        ;
                        *(uint *)(local_670.ray + 0x3bc) =
                             (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_670.ray + 0x3bc)
                        ;
                        iVar31 = *(int *)(local_670.hit + 0xc4);
                        iVar32 = *(int *)(local_670.hit + 200);
                        iVar33 = *(int *)(local_670.hit + 0xcc);
                        iVar34 = *(int *)(local_670.hit + 0xd0);
                        iVar35 = *(int *)(local_670.hit + 0xd4);
                        iVar36 = *(int *)(local_670.hit + 0xd8);
                        iVar37 = *(int *)(local_670.hit + 0xdc);
                        iVar38 = *(int *)(local_670.hit + 0xe0);
                        iVar39 = *(int *)(local_670.hit + 0xe4);
                        iVar40 = *(int *)(local_670.hit + 0xe8);
                        iVar41 = *(int *)(local_670.hit + 0xec);
                        iVar42 = *(int *)(local_670.hit + 0xf0);
                        iVar43 = *(int *)(local_670.hit + 0xf4);
                        iVar44 = *(int *)(local_670.hit + 0xf8);
                        iVar45 = *(int *)(local_670.hit + 0xfc);
                        bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
                        bVar56 = (bool)((byte)(uVar53 >> 2) & 1);
                        bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
                        bVar58 = (bool)((byte)(uVar53 >> 4) & 1);
                        bVar59 = (bool)((byte)(uVar53 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar53 >> 7) & 1);
                        bVar13 = (bool)((byte)(uVar53 >> 9) & 1);
                        bVar14 = (bool)((byte)(uVar53 >> 10) & 1);
                        bVar15 = (bool)((byte)(uVar53 >> 0xb) & 1);
                        bVar16 = (bool)((byte)(uVar53 >> 0xc) & 1);
                        bVar17 = (bool)((byte)(uVar53 >> 0xd) & 1);
                        bVar18 = (bool)((byte)(uVar53 >> 0xe) & 1);
                        bVar19 = SUB81(uVar53 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x3c0) =
                             (uint)(bVar46 & 1) * *(int *)(local_670.hit + 0xc0) |
                             (uint)!(bool)(bVar46 & 1) * *(int *)(local_670.ray + 0x3c0);
                        *(uint *)(local_670.ray + 0x3c4) =
                             (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_670.ray + 0x3c4)
                        ;
                        *(uint *)(local_670.ray + 0x3c8) =
                             (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_670.ray + 0x3c8)
                        ;
                        *(uint *)(local_670.ray + 0x3cc) =
                             (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_670.ray + 0x3cc)
                        ;
                        *(uint *)(local_670.ray + 0x3d0) =
                             (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_670.ray + 0x3d0)
                        ;
                        *(uint *)(local_670.ray + 0x3d4) =
                             (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_670.ray + 0x3d4)
                        ;
                        *(uint *)(local_670.ray + 0x3d8) =
                             (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_670.ray + 0x3d8)
                        ;
                        *(uint *)(local_670.ray + 0x3dc) =
                             (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_670.ray + 0x3dc)
                        ;
                        *(uint *)(local_670.ray + 0x3e0) =
                             (uint)(bVar12 & 1) * iVar38 |
                             (uint)!(bool)(bVar12 & 1) * *(int *)(local_670.ray + 0x3e0);
                        *(uint *)(local_670.ray + 0x3e4) =
                             (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_670.ray + 0x3e4)
                        ;
                        *(uint *)(local_670.ray + 1000) =
                             (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_670.ray + 1000);
                        *(uint *)(local_670.ray + 0x3ec) =
                             (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_670.ray + 0x3ec)
                        ;
                        *(uint *)(local_670.ray + 0x3f0) =
                             (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_670.ray + 0x3f0)
                        ;
                        *(uint *)(local_670.ray + 0x3f4) =
                             (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_670.ray + 0x3f4)
                        ;
                        *(uint *)(local_670.ray + 0x3f8) =
                             (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_670.ray + 0x3f8)
                        ;
                        *(uint *)(local_670.ray + 0x3fc) =
                             (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_670.ray + 0x3fc)
                        ;
                        iVar31 = *(int *)(local_670.hit + 0x104);
                        iVar32 = *(int *)(local_670.hit + 0x108);
                        iVar33 = *(int *)(local_670.hit + 0x10c);
                        iVar34 = *(int *)(local_670.hit + 0x110);
                        iVar35 = *(int *)(local_670.hit + 0x114);
                        iVar36 = *(int *)(local_670.hit + 0x118);
                        iVar37 = *(int *)(local_670.hit + 0x11c);
                        iVar38 = *(int *)(local_670.hit + 0x120);
                        iVar39 = *(int *)(local_670.hit + 0x124);
                        iVar40 = *(int *)(local_670.hit + 0x128);
                        iVar41 = *(int *)(local_670.hit + 300);
                        iVar42 = *(int *)(local_670.hit + 0x130);
                        iVar43 = *(int *)(local_670.hit + 0x134);
                        iVar44 = *(int *)(local_670.hit + 0x138);
                        iVar45 = *(int *)(local_670.hit + 0x13c);
                        bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
                        bVar56 = (bool)((byte)(uVar53 >> 2) & 1);
                        bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
                        bVar58 = (bool)((byte)(uVar53 >> 4) & 1);
                        bVar59 = (bool)((byte)(uVar53 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar53 >> 7) & 1);
                        bVar13 = (bool)((byte)(uVar53 >> 9) & 1);
                        bVar14 = (bool)((byte)(uVar53 >> 10) & 1);
                        bVar15 = (bool)((byte)(uVar53 >> 0xb) & 1);
                        bVar16 = (bool)((byte)(uVar53 >> 0xc) & 1);
                        bVar17 = (bool)((byte)(uVar53 >> 0xd) & 1);
                        bVar18 = (bool)((byte)(uVar53 >> 0xe) & 1);
                        bVar19 = SUB81(uVar53 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x400) =
                             (uint)(bVar46 & 1) * *(int *)(local_670.hit + 0x100) |
                             (uint)!(bool)(bVar46 & 1) * *(int *)(local_670.ray + 0x400);
                        *(uint *)(local_670.ray + 0x404) =
                             (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_670.ray + 0x404)
                        ;
                        *(uint *)(local_670.ray + 0x408) =
                             (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_670.ray + 0x408)
                        ;
                        *(uint *)(local_670.ray + 0x40c) =
                             (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_670.ray + 0x40c)
                        ;
                        *(uint *)(local_670.ray + 0x410) =
                             (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_670.ray + 0x410)
                        ;
                        *(uint *)(local_670.ray + 0x414) =
                             (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_670.ray + 0x414)
                        ;
                        *(uint *)(local_670.ray + 0x418) =
                             (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_670.ray + 0x418)
                        ;
                        *(uint *)(local_670.ray + 0x41c) =
                             (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_670.ray + 0x41c)
                        ;
                        *(uint *)(local_670.ray + 0x420) =
                             (uint)(bVar12 & 1) * iVar38 |
                             (uint)!(bool)(bVar12 & 1) * *(int *)(local_670.ray + 0x420);
                        *(uint *)(local_670.ray + 0x424) =
                             (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_670.ray + 0x424)
                        ;
                        *(uint *)(local_670.ray + 0x428) =
                             (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_670.ray + 0x428)
                        ;
                        *(uint *)(local_670.ray + 0x42c) =
                             (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_670.ray + 0x42c)
                        ;
                        *(uint *)(local_670.ray + 0x430) =
                             (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_670.ray + 0x430)
                        ;
                        *(uint *)(local_670.ray + 0x434) =
                             (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_670.ray + 0x434)
                        ;
                        *(uint *)(local_670.ray + 0x438) =
                             (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_670.ray + 0x438)
                        ;
                        *(uint *)(local_670.ray + 0x43c) =
                             (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_670.ray + 0x43c)
                        ;
                        auVar108 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x140));
                        auVar108 = vmovdqu32_avx512f(auVar108);
                        *(undefined1 (*) [64])(local_670.ray + 0x440) = auVar108;
                        auVar108 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x180));
                        auVar108 = vmovdqu32_avx512f(auVar108);
                        *(undefined1 (*) [64])(local_670.ray + 0x480) = auVar108;
                        auVar273 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x1c0));
                        auVar108 = vmovdqa32_avx512f(auVar273);
                        *(undefined1 (*) [64])(local_670.ray + 0x4c0) = auVar108;
                        auVar120 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x200));
                        bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
                        auVar30._4_56_ = auVar120._8_56_;
                        auVar30._0_4_ =
                             (uint)bVar57 * auVar120._4_4_ | (uint)!bVar57 * auVar273._4_4_;
                        auVar121._0_8_ = auVar30._0_8_ << 0x20;
                        bVar57 = (bool)((byte)(uVar53 >> 2) & 1);
                        auVar121._8_4_ =
                             (uint)bVar57 * auVar120._8_4_ | (uint)!bVar57 * auVar273._8_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 3) & 1);
                        auVar121._12_4_ =
                             (uint)bVar57 * auVar120._12_4_ | (uint)!bVar57 * auVar273._12_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 4) & 1);
                        auVar121._16_4_ =
                             (uint)bVar57 * auVar120._16_4_ | (uint)!bVar57 * auVar273._16_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 5) & 1);
                        auVar121._20_4_ =
                             (uint)bVar57 * auVar120._20_4_ | (uint)!bVar57 * auVar273._20_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 6) & 1);
                        auVar121._24_4_ =
                             (uint)bVar57 * auVar120._24_4_ | (uint)!bVar57 * auVar273._24_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 7) & 1);
                        auVar121._28_4_ =
                             (uint)bVar57 * auVar120._28_4_ | (uint)!bVar57 * auVar273._28_4_;
                        auVar121._32_4_ =
                             (uint)(bVar12 & 1) * auVar120._32_4_ |
                             (uint)!(bool)(bVar12 & 1) * auVar273._32_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 9) & 1);
                        auVar121._36_4_ =
                             (uint)bVar57 * auVar120._36_4_ | (uint)!bVar57 * auVar273._36_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 10) & 1);
                        auVar121._40_4_ =
                             (uint)bVar57 * auVar120._40_4_ | (uint)!bVar57 * auVar273._40_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 0xb) & 1);
                        auVar121._44_4_ =
                             (uint)bVar57 * auVar120._44_4_ | (uint)!bVar57 * auVar273._44_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 0xc) & 1);
                        auVar121._48_4_ =
                             (uint)bVar57 * auVar120._48_4_ | (uint)!bVar57 * auVar273._48_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 0xd) & 1);
                        auVar121._52_4_ =
                             (uint)bVar57 * auVar120._52_4_ | (uint)!bVar57 * auVar273._52_4_;
                        bVar57 = (bool)((byte)(uVar53 >> 0xe) & 1);
                        auVar121._56_4_ =
                             (uint)bVar57 * auVar120._56_4_ | (uint)!bVar57 * auVar273._56_4_;
                        bVar57 = SUB81(uVar53 >> 0xf,0);
                        auVar121._60_4_ =
                             (uint)bVar57 * auVar120._60_4_ | (uint)!bVar57 * auVar273._60_4_;
                        auVar108._16_48_ = auVar121._16_48_;
                        auVar273 = vmovdqa32_avx512f(auVar120);
                        *(undefined1 (*) [64])(local_670.ray + 0x500) = auVar273;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar248;
                    break;
                  }
                  lVar50 = lVar50 + -1;
                } while (lVar50 != 0);
              }
            }
          }
          auVar120._16_48_ = auVar108._16_48_;
          auVar120._0_16_ = local_640;
          auVar273 = ZEXT1664(local_640);
          if (uVar47 == 0) break;
        } while( true );
      }
      uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar26._4_4_ = uVar130;
      auVar26._0_4_ = uVar130;
      auVar26._8_4_ = uVar130;
      auVar26._12_4_ = uVar130;
      uVar21 = vcmpps_avx512vl(local_600,auVar26,2);
      uVar54 = (uint)uVar60 & (uint)uVar21;
      uVar60 = (ulong)uVar54;
    } while (uVar54 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }